

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O1

void av1_predict_intra_block
               (MACROBLOCKD *xd,BLOCK_SIZE sb_size,int enable_intra_edge_filter,int wpx,int hpx,
               TX_SIZE tx_size,PREDICTION_MODE mode,int angle_delta,int use_palette,
               FILTER_INTRA_MODE filter_intra_mode,uint8_t *ref,int ref_stride,uint8_t *dst,
               int dst_stride,int col_off,int row_off,int plane)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  MB_MODE_INFO *pMVar9;
  scale_factors *psVar10;
  scale_factors *psVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  intra_pred_fn (*pap_Var60) [19];
  intra_high_pred_fn (*pap_Var61) [19];
  char cVar62;
  byte bVar63;
  uint uVar64;
  uint uVar65;
  int iVar66;
  ulong uVar67;
  uint16_t *puVar68;
  byte bVar69;
  uint16_t *puVar70;
  uint16_t *puVar71;
  long lVar72;
  uint uVar73;
  size_t __n;
  ulong uVar74;
  long lVar75;
  uint16_t *puVar76;
  long lVar77;
  ushort uVar78;
  uint16_t uVar79;
  size_t sVar80;
  byte bVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  byte *pbVar85;
  uint8_t *puVar86;
  uint uVar87;
  ulong uVar88;
  uint16_t *puVar89;
  uint16_t *puVar90;
  uint uVar91;
  uint uVar92;
  uint8_t **ppuVar93;
  long lVar94;
  uint uVar95;
  undefined7 in_register_00000089;
  uint uVar96;
  ulong uVar97;
  size_t __n_00;
  uint uVar98;
  size_t __n_01;
  ulong uVar99;
  _func_void_uint8_t_ptr_ptrdiff_t_int_int_uint8_t_ptr_uint8_t_ptr_int_int_int **pp_Var100;
  byte bVar101;
  byte *pbVar102;
  byte bVar103;
  uint16_t *dest16_1;
  uint uVar104;
  uint uVar105;
  uint uVar106;
  byte *pbVar107;
  bool bVar108;
  bool bVar109;
  undefined4 uVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  int iVar249;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  int iVar250;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  int iVar251;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  int iVar252;
  int iVar263;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  int iVar264;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  uint local_bd0;
  uint local_bbc;
  uint16_t left_data_2 [160];
  undefined4 auStack_9f8 [7];
  uint16_t local_9da;
  ushort local_9d8;
  uint16_t auStack_9d6 [142];
  ushort uStack_8ba;
  uint16_t left_data [160];
  
  auVar190 = _DAT_004ce960;
  auVar189 = _DAT_004ce950;
  auVar288 = _DAT_004ccdb0;
  auVar279 = _DAT_004ccda0;
  auVar185 = _DAT_004ccd90;
  uVar88 = (ulong)(uint)((int)CONCAT71(in_register_00000089,tx_size) * 4);
  uVar105 = *(uint *)((long)tx_size_wide + uVar88);
  __n = (size_t)(int)uVar105;
  uVar87 = *(uint *)((long)tx_size_high + uVar88);
  __n_01 = (size_t)(int)uVar87;
  pMVar9 = *xd->mi;
  uVar104 = (uint)xd->cur_buf->flags >> 3;
  if (use_palette != 0) {
    uVar78 = xd->color_index_map_offset[plane != 0];
    puVar86 = xd->plane[plane != 0].color_index_map;
    if ((uVar104 & 1) == 0) {
      uVar88 = 1;
      if (1 < (int)uVar105) {
        uVar88 = (ulong)uVar105;
      }
      uVar74 = 1;
      if (1 < (int)uVar87) {
        uVar74 = (ulong)uVar87;
      }
      iVar82 = col_off * 4 + row_off * wpx * 4;
      uVar97 = 0;
      do {
        uVar99 = 0;
        do {
          dst[uVar99] = (uint8_t)(pMVar9->palette_mode_info).palette_colors
                                 [(long)(plane << 3) +
                                  (ulong)puVar86[(long)(iVar82 + (int)uVar99) + (ulong)uVar78]];
          uVar99 = uVar99 + 1;
        } while (uVar88 != uVar99);
        uVar97 = uVar97 + 1;
        dst = dst + dst_stride;
        iVar82 = iVar82 + wpx;
      } while (uVar97 != uVar74);
      return;
    }
    lVar77 = (long)dst * 2;
    uVar88 = 1;
    if (1 < (int)uVar105) {
      uVar88 = (ulong)uVar105;
    }
    uVar74 = 1;
    if (1 < (int)uVar87) {
      uVar74 = (ulong)uVar87;
    }
    iVar82 = col_off * 4 + row_off * wpx * 4;
    uVar97 = 0;
    do {
      uVar99 = 0;
      do {
        *(uint16_t *)(lVar77 + uVar99 * 2) =
             (pMVar9->palette_mode_info).palette_colors
             [(long)(plane << 3) + (ulong)puVar86[(long)(iVar82 + (int)uVar99) + (ulong)uVar78]];
        uVar99 = uVar99 + 1;
      } while (uVar88 != uVar99);
      uVar97 = uVar97 + 1;
      lVar77 = lVar77 + (long)dst_stride * 2;
      iVar82 = iVar82 + wpx;
    } while (uVar97 != uVar74);
    return;
  }
  uVar98 = xd->plane[plane].subsampling_y;
  bVar101 = 1;
  cVar62 = '\x01';
  if (row_off == 0) {
    cVar62 = *(char *)((long)xd->block_ref_scale_factors + (ulong)(uVar98 != 0) * 2 + -0x48);
  }
  uVar88 = CONCAT71(in_register_00000089,tx_size) & 0xffffffff;
  uVar74 = (ulong)mode;
  iVar82 = xd->plane[plane].subsampling_x;
  if (col_off == 0) {
    bVar101 = *(byte *)((long)xd->block_ref_scale_factors + (ulong)(iVar82 != 0) * 2 + -0x47);
  }
  bVar103 = (byte)iVar82;
  uVar64 = wpx + col_off * -4 + (xd->mb_to_right_edge >> (bVar103 + 3 & 0x1f));
  bVar2 = (byte)uVar98;
  uVar95 = hpx + row_off * -4 + (xd->mb_to_bottom_edge >> (bVar2 + 3 & 0x1f));
  uVar106 = uVar64;
  if ((int)uVar105 < (int)uVar64) {
    uVar106 = uVar105;
  }
  __n_00 = (size_t)uVar106;
  if (cVar62 == '\0') {
    __n_00 = 0;
  }
  uVar106 = uVar95;
  if ((int)uVar87 < (int)uVar95) {
    uVar106 = uVar87;
  }
  uVar97 = (ulong)uVar106;
  if (bVar101 == 0) {
    uVar97 = 0;
  }
  local_bd0 = (uint)__n_00;
  uVar106 = (uint)uVar97;
  if (7 < (byte)(mode - 1) && filter_intra_mode == '\x05') {
    lVar77 = (long)ref_stride;
    if ((uVar104 & 1) != 0) {
      iVar82 = xd->bd;
      puVar68 = (uint16_t *)((long)dst * 2);
      bVar101 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[uVar74];
      uVar104 = 0x80 << ((char)iVar82 - 8U & 0x1f);
      puVar76 = (uint16_t *)((long)ref * 2 + lVar77 * -2);
      puVar90 = (uint16_t *)((long)ref * 2 + -2);
      uVar78 = (ushort)uVar104;
      if (((bVar101 & 4) != 0 || uVar106 != 0) && ((bVar101 & 2) != 0 || local_bd0 != 0)) {
        if ((bVar101 & 2) != 0) {
          auVar185 = pshuflw(ZEXT416(uVar104 | 1),ZEXT416(uVar104 | 1),0);
          uVar110 = auVar185._0_4_;
          lVar72 = 0;
          do {
            *(undefined4 *)(left_data + lVar72) = uVar110;
            *(undefined4 *)(left_data + lVar72 + 2) = uVar110;
            *(undefined4 *)(left_data + lVar72 + 4) = uVar110;
            *(undefined4 *)(left_data + lVar72 + 6) = uVar110;
            lVar72 = lVar72 + 8;
          } while (lVar72 != 0xa0);
          if ((int)uVar106 < 1) {
            if (0 < (int)local_bd0) {
              uVar79 = *puVar76;
              lVar77 = __n_01 - 1;
              auVar185._8_4_ = (int)lVar77;
              auVar185._0_8_ = lVar77;
              auVar185._12_4_ = (int)((ulong)lVar77 >> 0x20);
              uVar97 = 0;
              auVar185 = auVar185 ^ _DAT_004ccdb0;
              do {
                auVar288._8_4_ = (int)uVar97;
                auVar288._0_8_ = uVar97;
                auVar288._12_4_ = (int)(uVar97 >> 0x20);
                auVar279 = (auVar288 | _DAT_004ccda0) ^ _DAT_004ccdb0;
                iVar66 = auVar185._0_4_;
                iVar249 = -(uint)(iVar66 < auVar279._0_4_);
                iVar83 = auVar185._4_4_;
                auVar190._4_4_ = -(uint)(iVar83 < auVar279._4_4_);
                iVar84 = auVar185._8_4_;
                iVar250 = -(uint)(iVar84 < auVar279._8_4_);
                iVar251 = auVar185._12_4_;
                auVar190._12_4_ = -(uint)(iVar251 < auVar279._12_4_);
                auVar216._4_4_ = iVar249;
                auVar216._0_4_ = iVar249;
                auVar216._8_4_ = iVar250;
                auVar216._12_4_ = iVar250;
                auVar114 = pshuflw(in_XMM11,auVar216,0xe8);
                auVar189._4_4_ = -(uint)(auVar279._4_4_ == iVar83);
                auVar189._12_4_ = -(uint)(auVar279._12_4_ == iVar251);
                auVar189._0_4_ = auVar189._4_4_;
                auVar189._8_4_ = auVar189._12_4_;
                auVar287 = pshuflw(in_XMM12,auVar189,0xe8);
                auVar190._0_4_ = auVar190._4_4_;
                auVar190._8_4_ = auVar190._12_4_;
                auVar274 = pshuflw(auVar114,auVar190,0xe8);
                auVar279._8_4_ = 0xffffffff;
                auVar279._0_8_ = 0xffffffffffffffff;
                auVar279._12_4_ = 0xffffffff;
                auVar279 = (auVar274 | auVar287 & auVar114) ^ auVar279;
                auVar279 = packssdw(auVar279,auVar279);
                if ((auVar279 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  left_data[uVar97 + 0x10] = uVar79;
                }
                auVar190 = auVar189 & auVar216 | auVar190;
                auVar279 = packssdw(auVar190,auVar190);
                auVar52._8_4_ = 0xffffffff;
                auVar52._0_8_ = 0xffffffffffffffff;
                auVar52._12_4_ = 0xffffffff;
                auVar279 = packssdw(auVar279 ^ auVar52,auVar279 ^ auVar52);
                if ((auVar279._0_4_ >> 0x10 & 1) != 0) {
                  left_data[uVar97 + 0x11] = uVar79;
                }
                auVar279 = (auVar288 | _DAT_004ccd90) ^ _DAT_004ccdb0;
                iVar249 = -(uint)(iVar66 < auVar279._0_4_);
                auVar255._4_4_ = -(uint)(iVar83 < auVar279._4_4_);
                iVar250 = -(uint)(iVar84 < auVar279._8_4_);
                auVar255._12_4_ = -(uint)(iVar251 < auVar279._12_4_);
                auVar150._4_4_ = iVar249;
                auVar150._0_4_ = iVar249;
                auVar150._8_4_ = iVar250;
                auVar150._12_4_ = iVar250;
                auVar217._4_4_ = -(uint)(auVar279._4_4_ == iVar83);
                auVar217._12_4_ = -(uint)(auVar279._12_4_ == iVar251);
                auVar217._0_4_ = auVar217._4_4_;
                auVar217._8_4_ = auVar217._12_4_;
                auVar255._0_4_ = auVar255._4_4_;
                auVar255._8_4_ = auVar255._12_4_;
                auVar279 = auVar217 & auVar150 | auVar255;
                auVar279 = packssdw(auVar279,auVar279);
                auVar53._8_4_ = 0xffffffff;
                auVar53._0_8_ = 0xffffffffffffffff;
                auVar53._12_4_ = 0xffffffff;
                auVar279 = packssdw(auVar279 ^ auVar53,auVar279 ^ auVar53);
                if ((auVar279 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  left_data[uVar97 + 0x12] = uVar79;
                }
                auVar189 = pshufhw(auVar150,auVar150,0x84);
                auVar274 = pshufhw(auVar217,auVar217,0x84);
                auVar190 = pshufhw(auVar189,auVar255,0x84);
                auVar151._8_4_ = 0xffffffff;
                auVar151._0_8_ = 0xffffffffffffffff;
                auVar151._12_4_ = 0xffffffff;
                auVar151 = (auVar190 | auVar274 & auVar189) ^ auVar151;
                auVar189 = packssdw(auVar151,auVar151);
                if ((auVar189 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  left_data[uVar97 + 0x13] = uVar79;
                }
                auVar189 = (auVar288 | _DAT_004ce960) ^ _DAT_004ccdb0;
                iVar249 = -(uint)(iVar66 < auVar189._0_4_);
                auVar153._4_4_ = -(uint)(iVar83 < auVar189._4_4_);
                iVar250 = -(uint)(iVar84 < auVar189._8_4_);
                auVar153._12_4_ = -(uint)(iVar251 < auVar189._12_4_);
                auVar218._4_4_ = iVar249;
                auVar218._0_4_ = iVar249;
                auVar218._8_4_ = iVar250;
                auVar218._12_4_ = iVar250;
                auVar279 = pshuflw(auVar279,auVar218,0xe8);
                auVar152._4_4_ = -(uint)(auVar189._4_4_ == iVar83);
                auVar152._12_4_ = -(uint)(auVar189._12_4_ == iVar251);
                auVar152._0_4_ = auVar152._4_4_;
                auVar152._8_4_ = auVar152._12_4_;
                auVar189 = pshuflw(auVar287 & auVar114,auVar152,0xe8);
                in_XMM12 = auVar189 & auVar279;
                auVar153._0_4_ = auVar153._4_4_;
                auVar153._8_4_ = auVar153._12_4_;
                auVar279 = pshuflw(auVar279,auVar153,0xe8);
                auVar269._8_4_ = 0xffffffff;
                auVar269._0_8_ = 0xffffffffffffffff;
                auVar269._12_4_ = 0xffffffff;
                auVar269 = (auVar279 | in_XMM12) ^ auVar269;
                in_XMM11 = packssdw(auVar269,auVar269);
                if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  left_data[uVar97 + 0x14] = uVar79;
                }
                auVar153 = auVar152 & auVar218 | auVar153;
                auVar279 = packssdw(auVar153,auVar153);
                auVar54._8_4_ = 0xffffffff;
                auVar54._0_8_ = 0xffffffffffffffff;
                auVar54._12_4_ = 0xffffffff;
                auVar279 = packssdw(auVar279 ^ auVar54,auVar279 ^ auVar54);
                if ((auVar279 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  left_data[uVar97 + 0x15] = uVar79;
                }
                auVar279 = (auVar288 | _DAT_004ce950) ^ _DAT_004ccdb0;
                iVar66 = -(uint)(iVar66 < auVar279._0_4_);
                auVar219._4_4_ = -(uint)(iVar83 < auVar279._4_4_);
                iVar84 = -(uint)(iVar84 < auVar279._8_4_);
                auVar219._12_4_ = -(uint)(iVar251 < auVar279._12_4_);
                auVar154._4_4_ = iVar66;
                auVar154._0_4_ = iVar66;
                auVar154._8_4_ = iVar84;
                auVar154._12_4_ = iVar84;
                auVar123._4_4_ = -(uint)(auVar279._4_4_ == iVar83);
                auVar123._12_4_ = -(uint)(auVar279._12_4_ == iVar251);
                auVar123._0_4_ = auVar123._4_4_;
                auVar123._8_4_ = auVar123._12_4_;
                auVar219._0_4_ = auVar219._4_4_;
                auVar219._8_4_ = auVar219._12_4_;
                auVar279 = auVar123 & auVar154 | auVar219;
                auVar279 = packssdw(auVar279,auVar279);
                auVar55._8_4_ = 0xffffffff;
                auVar55._0_8_ = 0xffffffffffffffff;
                auVar55._12_4_ = 0xffffffff;
                auVar279 = packssdw(auVar279 ^ auVar55,auVar279 ^ auVar55);
                if ((auVar279 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  left_data[uVar97 + 0x16] = uVar79;
                }
                auVar288 = pshufhw(auVar154,auVar154,0x84);
                auVar279 = pshufhw(auVar123,auVar123,0x84);
                auVar189 = pshufhw(auVar288,auVar219,0x84);
                auVar56._8_4_ = 0xffffffff;
                auVar56._0_8_ = 0xffffffffffffffff;
                auVar56._12_4_ = 0xffffffff;
                auVar279 = packssdw(auVar279 & auVar288,(auVar189 | auVar279 & auVar288) ^ auVar56);
                if ((auVar279 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  left_data[uVar97 + 0x17] = uVar79;
                }
                uVar97 = uVar97 + 8;
              } while ((__n_01 + 7 & 0xfffffffffffffff8) != uVar97);
            }
          }
          else {
            uVar99 = 0;
            puVar71 = left_data + 0x17;
            puVar89 = puVar90;
            do {
              puVar70 = puVar71;
              puVar70[-7] = *puVar89;
              uVar99 = uVar99 + 1;
              puVar71 = puVar70 + 1;
              puVar89 = puVar89 + lVar77;
            } while (uVar97 != uVar99);
            if ((int)uVar99 < (int)uVar87) {
              uVar79 = puVar70[-7];
              lVar77 = (__n_01 - uVar97) + -1;
              auVar111._8_4_ = (int)lVar77;
              auVar111._0_8_ = lVar77;
              auVar111._12_4_ = (int)((ulong)lVar77 >> 0x20);
              uVar99 = 0;
              auVar111 = auVar111 ^ _DAT_004ccdb0;
              do {
                auVar120._8_4_ = (int)uVar99;
                auVar120._0_8_ = uVar99;
                auVar120._12_4_ = (int)(uVar99 >> 0x20);
                auVar185 = (auVar120 | _DAT_004ccda0) ^ _DAT_004ccdb0;
                iVar66 = auVar111._0_4_;
                iVar249 = -(uint)(iVar66 < auVar185._0_4_);
                iVar83 = auVar111._4_4_;
                auVar139._4_4_ = -(uint)(iVar83 < auVar185._4_4_);
                iVar84 = auVar111._8_4_;
                iVar250 = -(uint)(iVar84 < auVar185._8_4_);
                iVar251 = auVar111._12_4_;
                auVar139._12_4_ = -(uint)(iVar251 < auVar185._12_4_);
                auVar209._4_4_ = iVar249;
                auVar209._0_4_ = iVar249;
                auVar209._8_4_ = iVar250;
                auVar209._12_4_ = iVar250;
                auVar279 = pshuflw(in_XMM11,auVar209,0xe8);
                auVar138._4_4_ = -(uint)(auVar185._4_4_ == iVar83);
                auVar138._12_4_ = -(uint)(auVar185._12_4_ == iVar251);
                auVar138._0_4_ = auVar138._4_4_;
                auVar138._8_4_ = auVar138._12_4_;
                auVar288 = pshuflw(in_XMM12,auVar138,0xe8);
                auVar139._0_4_ = auVar139._4_4_;
                auVar139._8_4_ = auVar139._12_4_;
                auVar185 = pshuflw(auVar279,auVar139,0xe8);
                auVar265._8_4_ = 0xffffffff;
                auVar265._0_8_ = 0xffffffffffffffff;
                auVar265._12_4_ = 0xffffffff;
                auVar265 = (auVar185 | auVar288 & auVar279) ^ auVar265;
                auVar185 = packssdw(auVar265,auVar265);
                if ((auVar185 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  puVar71[-7] = uVar79;
                }
                auVar139 = auVar138 & auVar209 | auVar139;
                auVar185 = packssdw(auVar139,auVar139);
                auVar37._8_4_ = 0xffffffff;
                auVar37._0_8_ = 0xffffffffffffffff;
                auVar37._12_4_ = 0xffffffff;
                auVar185 = packssdw(auVar185 ^ auVar37,auVar185 ^ auVar37);
                if ((auVar185._0_4_ >> 0x10 & 1) != 0) {
                  puVar71[-6] = uVar79;
                }
                auVar185 = (auVar120 | _DAT_004ccd90) ^ _DAT_004ccdb0;
                iVar249 = -(uint)(iVar66 < auVar185._0_4_);
                auVar253._4_4_ = -(uint)(iVar83 < auVar185._4_4_);
                iVar250 = -(uint)(iVar84 < auVar185._8_4_);
                auVar253._12_4_ = -(uint)(iVar251 < auVar185._12_4_);
                auVar140._4_4_ = iVar249;
                auVar140._0_4_ = iVar249;
                auVar140._8_4_ = iVar250;
                auVar140._12_4_ = iVar250;
                auVar210._4_4_ = -(uint)(auVar185._4_4_ == iVar83);
                auVar210._12_4_ = -(uint)(auVar185._12_4_ == iVar251);
                auVar210._0_4_ = auVar210._4_4_;
                auVar210._8_4_ = auVar210._12_4_;
                auVar253._0_4_ = auVar253._4_4_;
                auVar253._8_4_ = auVar253._12_4_;
                auVar185 = auVar210 & auVar140 | auVar253;
                auVar185 = packssdw(auVar185,auVar185);
                auVar38._8_4_ = 0xffffffff;
                auVar38._0_8_ = 0xffffffffffffffff;
                auVar38._12_4_ = 0xffffffff;
                auVar185 = packssdw(auVar185 ^ auVar38,auVar185 ^ auVar38);
                if ((auVar185 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  puVar71[-5] = uVar79;
                }
                auVar189 = pshufhw(auVar140,auVar140,0x84);
                auVar114 = pshufhw(auVar210,auVar210,0x84);
                auVar190 = pshufhw(auVar189,auVar253,0x84);
                auVar141._8_4_ = 0xffffffff;
                auVar141._0_8_ = 0xffffffffffffffff;
                auVar141._12_4_ = 0xffffffff;
                auVar141 = (auVar190 | auVar114 & auVar189) ^ auVar141;
                auVar189 = packssdw(auVar141,auVar141);
                if ((auVar189 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  puVar71[-4] = uVar79;
                }
                auVar189 = (auVar120 | _DAT_004ce960) ^ _DAT_004ccdb0;
                iVar249 = -(uint)(iVar66 < auVar189._0_4_);
                auVar143._4_4_ = -(uint)(iVar83 < auVar189._4_4_);
                iVar250 = -(uint)(iVar84 < auVar189._8_4_);
                auVar143._12_4_ = -(uint)(iVar251 < auVar189._12_4_);
                auVar211._4_4_ = iVar249;
                auVar211._0_4_ = iVar249;
                auVar211._8_4_ = iVar250;
                auVar211._12_4_ = iVar250;
                auVar185 = pshuflw(auVar185,auVar211,0xe8);
                auVar142._4_4_ = -(uint)(auVar189._4_4_ == iVar83);
                auVar142._12_4_ = -(uint)(auVar189._12_4_ == iVar251);
                auVar142._0_4_ = auVar142._4_4_;
                auVar142._8_4_ = auVar142._12_4_;
                auVar279 = pshuflw(auVar288 & auVar279,auVar142,0xe8);
                in_XMM12 = auVar279 & auVar185;
                auVar143._0_4_ = auVar143._4_4_;
                auVar143._8_4_ = auVar143._12_4_;
                auVar185 = pshuflw(auVar185,auVar143,0xe8);
                auVar266._8_4_ = 0xffffffff;
                auVar266._0_8_ = 0xffffffffffffffff;
                auVar266._12_4_ = 0xffffffff;
                auVar266 = (auVar185 | in_XMM12) ^ auVar266;
                in_XMM11 = packssdw(auVar266,auVar266);
                if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  puVar71[-3] = uVar79;
                }
                auVar143 = auVar142 & auVar211 | auVar143;
                auVar185 = packssdw(auVar143,auVar143);
                auVar39._8_4_ = 0xffffffff;
                auVar39._0_8_ = 0xffffffffffffffff;
                auVar39._12_4_ = 0xffffffff;
                auVar185 = packssdw(auVar185 ^ auVar39,auVar185 ^ auVar39);
                if ((auVar185 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  puVar71[-2] = uVar79;
                }
                auVar185 = (auVar120 | _DAT_004ce950) ^ _DAT_004ccdb0;
                iVar66 = -(uint)(iVar66 < auVar185._0_4_);
                auVar212._4_4_ = -(uint)(iVar83 < auVar185._4_4_);
                iVar84 = -(uint)(iVar84 < auVar185._8_4_);
                auVar212._12_4_ = -(uint)(iVar251 < auVar185._12_4_);
                auVar144._4_4_ = iVar66;
                auVar144._0_4_ = iVar66;
                auVar144._8_4_ = iVar84;
                auVar144._12_4_ = iVar84;
                auVar121._4_4_ = -(uint)(auVar185._4_4_ == iVar83);
                auVar121._12_4_ = -(uint)(auVar185._12_4_ == iVar251);
                auVar121._0_4_ = auVar121._4_4_;
                auVar121._8_4_ = auVar121._12_4_;
                auVar212._0_4_ = auVar212._4_4_;
                auVar212._8_4_ = auVar212._12_4_;
                auVar185 = auVar121 & auVar144 | auVar212;
                auVar185 = packssdw(auVar185,auVar185);
                auVar40._8_4_ = 0xffffffff;
                auVar40._0_8_ = 0xffffffffffffffff;
                auVar40._12_4_ = 0xffffffff;
                auVar185 = packssdw(auVar185 ^ auVar40,auVar185 ^ auVar40);
                if ((auVar185 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  puVar71[-1] = uVar79;
                }
                auVar279 = pshufhw(auVar144,auVar144,0x84);
                auVar185 = pshufhw(auVar121,auVar121,0x84);
                auVar288 = pshufhw(auVar279,auVar212,0x84);
                auVar41._8_4_ = 0xffffffff;
                auVar41._0_8_ = 0xffffffffffffffff;
                auVar41._12_4_ = 0xffffffff;
                auVar185 = packssdw(auVar185 & auVar279,(auVar288 | auVar185 & auVar279) ^ auVar41);
                if ((auVar185 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *puVar71 = uVar79;
                }
                uVar99 = uVar99 + 8;
                puVar71 = puVar71 + 8;
              } while (((__n_01 - uVar97) + 7 & 0xfffffffffffffff8) != uVar99);
            }
          }
        }
        if ((bVar101 & 4) != 0) {
          auVar185 = pshuflw(ZEXT416(uVar104 - 1),ZEXT416(uVar104 - 1),0);
          uVar110 = auVar185._0_4_;
          lVar77 = 0;
          do {
            *(undefined4 *)(left_data_2 + lVar77) = uVar110;
            *(undefined4 *)(left_data_2 + lVar77 + 2) = uVar110;
            *(undefined4 *)(left_data_2 + lVar77 + 4) = uVar110;
            *(undefined4 *)(left_data_2 + lVar77 + 6) = uVar110;
            lVar77 = lVar77 + 8;
          } while (lVar77 != 0xa0);
          if ((int)local_bd0 < 1) {
            if (0 < (int)uVar106) {
              uVar79 = *puVar90;
              lVar77 = __n - 1;
              auVar113._8_4_ = (int)lVar77;
              auVar113._0_8_ = lVar77;
              auVar113._12_4_ = (int)((ulong)lVar77 >> 0x20);
              uVar97 = 0;
              auVar113 = auVar113 ^ _DAT_004ccdb0;
              do {
                auVar126._8_4_ = (int)uVar97;
                auVar126._0_8_ = uVar97;
                auVar126._12_4_ = (int)(uVar97 >> 0x20);
                auVar185 = (auVar126 | _DAT_004ccda0) ^ _DAT_004ccdb0;
                iVar66 = auVar113._0_4_;
                iVar249 = -(uint)(iVar66 < auVar185._0_4_);
                iVar83 = auVar113._4_4_;
                auVar163._4_4_ = -(uint)(iVar83 < auVar185._4_4_);
                iVar84 = auVar113._8_4_;
                iVar250 = -(uint)(iVar84 < auVar185._8_4_);
                iVar251 = auVar113._12_4_;
                auVar163._12_4_ = -(uint)(iVar251 < auVar185._12_4_);
                auVar224._4_4_ = iVar249;
                auVar224._0_4_ = iVar249;
                auVar224._8_4_ = iVar250;
                auVar224._12_4_ = iVar250;
                auVar279 = pshuflw(in_XMM11,auVar224,0xe8);
                auVar162._4_4_ = -(uint)(auVar185._4_4_ == iVar83);
                auVar162._12_4_ = -(uint)(auVar185._12_4_ == iVar251);
                auVar162._0_4_ = auVar162._4_4_;
                auVar162._8_4_ = auVar162._12_4_;
                auVar288 = pshuflw(in_XMM12,auVar162,0xe8);
                auVar163._0_4_ = auVar163._4_4_;
                auVar163._8_4_ = auVar163._12_4_;
                auVar185 = pshuflw(auVar279,auVar163,0xe8);
                auVar272._8_4_ = 0xffffffff;
                auVar272._0_8_ = 0xffffffffffffffff;
                auVar272._12_4_ = 0xffffffff;
                auVar272 = (auVar185 | auVar288 & auVar279) ^ auVar272;
                auVar185 = packssdw(auVar272,auVar272);
                if ((auVar185 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  left_data_2[uVar97 + 0x10] = uVar79;
                }
                auVar163 = auVar162 & auVar224 | auVar163;
                auVar185 = packssdw(auVar163,auVar163);
                auVar47._8_4_ = 0xffffffff;
                auVar47._0_8_ = 0xffffffffffffffff;
                auVar47._12_4_ = 0xffffffff;
                auVar185 = packssdw(auVar185 ^ auVar47,auVar185 ^ auVar47);
                if ((auVar185._0_4_ >> 0x10 & 1) != 0) {
                  left_data_2[uVar97 + 0x11] = uVar79;
                }
                auVar185 = (auVar126 | _DAT_004ccd90) ^ _DAT_004ccdb0;
                iVar249 = -(uint)(iVar66 < auVar185._0_4_);
                auVar257._4_4_ = -(uint)(iVar83 < auVar185._4_4_);
                iVar250 = -(uint)(iVar84 < auVar185._8_4_);
                auVar257._12_4_ = -(uint)(iVar251 < auVar185._12_4_);
                auVar164._4_4_ = iVar249;
                auVar164._0_4_ = iVar249;
                auVar164._8_4_ = iVar250;
                auVar164._12_4_ = iVar250;
                auVar225._4_4_ = -(uint)(auVar185._4_4_ == iVar83);
                auVar225._12_4_ = -(uint)(auVar185._12_4_ == iVar251);
                auVar225._0_4_ = auVar225._4_4_;
                auVar225._8_4_ = auVar225._12_4_;
                auVar257._0_4_ = auVar257._4_4_;
                auVar257._8_4_ = auVar257._12_4_;
                auVar185 = auVar225 & auVar164 | auVar257;
                auVar185 = packssdw(auVar185,auVar185);
                auVar48._8_4_ = 0xffffffff;
                auVar48._0_8_ = 0xffffffffffffffff;
                auVar48._12_4_ = 0xffffffff;
                auVar185 = packssdw(auVar185 ^ auVar48,auVar185 ^ auVar48);
                if ((auVar185 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  left_data_2[uVar97 + 0x12] = uVar79;
                }
                auVar189 = pshufhw(auVar164,auVar164,0x84);
                auVar114 = pshufhw(auVar225,auVar225,0x84);
                auVar190 = pshufhw(auVar189,auVar257,0x84);
                auVar165._8_4_ = 0xffffffff;
                auVar165._0_8_ = 0xffffffffffffffff;
                auVar165._12_4_ = 0xffffffff;
                auVar165 = (auVar190 | auVar114 & auVar189) ^ auVar165;
                auVar189 = packssdw(auVar165,auVar165);
                if ((auVar189 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  left_data_2[uVar97 + 0x13] = uVar79;
                }
                auVar189 = (auVar126 | _DAT_004ce960) ^ _DAT_004ccdb0;
                iVar249 = -(uint)(iVar66 < auVar189._0_4_);
                auVar167._4_4_ = -(uint)(iVar83 < auVar189._4_4_);
                iVar250 = -(uint)(iVar84 < auVar189._8_4_);
                auVar167._12_4_ = -(uint)(iVar251 < auVar189._12_4_);
                auVar226._4_4_ = iVar249;
                auVar226._0_4_ = iVar249;
                auVar226._8_4_ = iVar250;
                auVar226._12_4_ = iVar250;
                auVar185 = pshuflw(auVar185,auVar226,0xe8);
                auVar166._4_4_ = -(uint)(auVar189._4_4_ == iVar83);
                auVar166._12_4_ = -(uint)(auVar189._12_4_ == iVar251);
                auVar166._0_4_ = auVar166._4_4_;
                auVar166._8_4_ = auVar166._12_4_;
                auVar279 = pshuflw(auVar288 & auVar279,auVar166,0xe8);
                in_XMM12 = auVar279 & auVar185;
                auVar167._0_4_ = auVar167._4_4_;
                auVar167._8_4_ = auVar167._12_4_;
                auVar185 = pshuflw(auVar185,auVar167,0xe8);
                auVar273._8_4_ = 0xffffffff;
                auVar273._0_8_ = 0xffffffffffffffff;
                auVar273._12_4_ = 0xffffffff;
                auVar273 = (auVar185 | in_XMM12) ^ auVar273;
                in_XMM11 = packssdw(auVar273,auVar273);
                if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  left_data_2[uVar97 + 0x14] = uVar79;
                }
                auVar167 = auVar166 & auVar226 | auVar167;
                auVar185 = packssdw(auVar167,auVar167);
                auVar49._8_4_ = 0xffffffff;
                auVar49._0_8_ = 0xffffffffffffffff;
                auVar49._12_4_ = 0xffffffff;
                auVar185 = packssdw(auVar185 ^ auVar49,auVar185 ^ auVar49);
                if ((auVar185 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  left_data_2[uVar97 + 0x15] = uVar79;
                }
                auVar185 = (auVar126 | _DAT_004ce950) ^ _DAT_004ccdb0;
                iVar66 = -(uint)(iVar66 < auVar185._0_4_);
                auVar227._4_4_ = -(uint)(iVar83 < auVar185._4_4_);
                iVar84 = -(uint)(iVar84 < auVar185._8_4_);
                auVar227._12_4_ = -(uint)(iVar251 < auVar185._12_4_);
                auVar168._4_4_ = iVar66;
                auVar168._0_4_ = iVar66;
                auVar168._8_4_ = iVar84;
                auVar168._12_4_ = iVar84;
                auVar127._4_4_ = -(uint)(auVar185._4_4_ == iVar83);
                auVar127._12_4_ = -(uint)(auVar185._12_4_ == iVar251);
                auVar127._0_4_ = auVar127._4_4_;
                auVar127._8_4_ = auVar127._12_4_;
                auVar227._0_4_ = auVar227._4_4_;
                auVar227._8_4_ = auVar227._12_4_;
                auVar185 = auVar127 & auVar168 | auVar227;
                auVar185 = packssdw(auVar185,auVar185);
                auVar50._8_4_ = 0xffffffff;
                auVar50._0_8_ = 0xffffffffffffffff;
                auVar50._12_4_ = 0xffffffff;
                auVar185 = packssdw(auVar185 ^ auVar50,auVar185 ^ auVar50);
                if ((auVar185 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  left_data_2[uVar97 + 0x16] = uVar79;
                }
                auVar279 = pshufhw(auVar168,auVar168,0x84);
                auVar185 = pshufhw(auVar127,auVar127,0x84);
                auVar288 = pshufhw(auVar279,auVar227,0x84);
                auVar51._8_4_ = 0xffffffff;
                auVar51._0_8_ = 0xffffffffffffffff;
                auVar51._12_4_ = 0xffffffff;
                auVar185 = packssdw(auVar185 & auVar279,(auVar288 | auVar185 & auVar279) ^ auVar51);
                if ((auVar185 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  left_data_2[uVar97 + 0x17] = uVar79;
                }
                uVar97 = uVar97 + 8;
              } while ((__n + 7 & 0xfffffffffffffff8) != uVar97);
            }
          }
          else {
            memcpy(left_data_2 + 0x10,puVar76,__n_00 * 2);
            if ((int)local_bd0 < (int)uVar105) {
              uVar79 = left_data_2[__n_00 + 0xf];
              lVar77 = (long)(int)(uVar105 - local_bd0) + -1;
              auVar112._8_4_ = (int)lVar77;
              auVar112._0_8_ = lVar77;
              auVar112._12_4_ = (int)((ulong)lVar77 >> 0x20);
              uVar97 = 0;
              auVar112 = auVar112 ^ _DAT_004ccdb0;
              do {
                auVar124._8_4_ = (int)uVar97;
                auVar124._0_8_ = uVar97;
                auVar124._12_4_ = (int)(uVar97 >> 0x20);
                auVar185 = (auVar124 | _DAT_004ccda0) ^ _DAT_004ccdb0;
                iVar66 = auVar112._0_4_;
                iVar249 = -(uint)(iVar66 < auVar185._0_4_);
                iVar83 = auVar112._4_4_;
                auVar156._4_4_ = -(uint)(iVar83 < auVar185._4_4_);
                iVar84 = auVar112._8_4_;
                iVar250 = -(uint)(iVar84 < auVar185._8_4_);
                iVar251 = auVar112._12_4_;
                auVar156._12_4_ = -(uint)(iVar251 < auVar185._12_4_);
                auVar220._4_4_ = iVar249;
                auVar220._0_4_ = iVar249;
                auVar220._8_4_ = iVar250;
                auVar220._12_4_ = iVar250;
                auVar279 = pshuflw(in_XMM11,auVar220,0xe8);
                auVar155._4_4_ = -(uint)(auVar185._4_4_ == iVar83);
                auVar155._12_4_ = -(uint)(auVar185._12_4_ == iVar251);
                auVar155._0_4_ = auVar155._4_4_;
                auVar155._8_4_ = auVar155._12_4_;
                auVar288 = pshuflw(in_XMM12,auVar155,0xe8);
                auVar156._0_4_ = auVar156._4_4_;
                auVar156._8_4_ = auVar156._12_4_;
                auVar185 = pshuflw(auVar279,auVar156,0xe8);
                auVar270._8_4_ = 0xffffffff;
                auVar270._0_8_ = 0xffffffffffffffff;
                auVar270._12_4_ = 0xffffffff;
                auVar270 = (auVar185 | auVar288 & auVar279) ^ auVar270;
                auVar185 = packssdw(auVar270,auVar270);
                if ((auVar185 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  left_data_2[__n_00 + uVar97 + 0x10] = uVar79;
                }
                auVar156 = auVar155 & auVar220 | auVar156;
                auVar185 = packssdw(auVar156,auVar156);
                auVar42._8_4_ = 0xffffffff;
                auVar42._0_8_ = 0xffffffffffffffff;
                auVar42._12_4_ = 0xffffffff;
                auVar185 = packssdw(auVar185 ^ auVar42,auVar185 ^ auVar42);
                if ((auVar185._0_4_ >> 0x10 & 1) != 0) {
                  left_data_2[__n_00 + uVar97 + 0x11] = uVar79;
                }
                auVar185 = (auVar124 | _DAT_004ccd90) ^ _DAT_004ccdb0;
                iVar249 = -(uint)(iVar66 < auVar185._0_4_);
                auVar256._4_4_ = -(uint)(iVar83 < auVar185._4_4_);
                iVar250 = -(uint)(iVar84 < auVar185._8_4_);
                auVar256._12_4_ = -(uint)(iVar251 < auVar185._12_4_);
                auVar157._4_4_ = iVar249;
                auVar157._0_4_ = iVar249;
                auVar157._8_4_ = iVar250;
                auVar157._12_4_ = iVar250;
                auVar221._4_4_ = -(uint)(auVar185._4_4_ == iVar83);
                auVar221._12_4_ = -(uint)(auVar185._12_4_ == iVar251);
                auVar221._0_4_ = auVar221._4_4_;
                auVar221._8_4_ = auVar221._12_4_;
                auVar256._0_4_ = auVar256._4_4_;
                auVar256._8_4_ = auVar256._12_4_;
                auVar185 = auVar221 & auVar157 | auVar256;
                auVar185 = packssdw(auVar185,auVar185);
                auVar43._8_4_ = 0xffffffff;
                auVar43._0_8_ = 0xffffffffffffffff;
                auVar43._12_4_ = 0xffffffff;
                auVar185 = packssdw(auVar185 ^ auVar43,auVar185 ^ auVar43);
                if ((auVar185 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  left_data_2[__n_00 + uVar97 + 0x12] = uVar79;
                }
                auVar189 = pshufhw(auVar157,auVar157,0x84);
                auVar114 = pshufhw(auVar221,auVar221,0x84);
                auVar190 = pshufhw(auVar189,auVar256,0x84);
                auVar158._8_4_ = 0xffffffff;
                auVar158._0_8_ = 0xffffffffffffffff;
                auVar158._12_4_ = 0xffffffff;
                auVar158 = (auVar190 | auVar114 & auVar189) ^ auVar158;
                auVar189 = packssdw(auVar158,auVar158);
                if ((auVar189 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  left_data_2[__n_00 + uVar97 + 0x13] = uVar79;
                }
                auVar189 = (auVar124 | _DAT_004ce960) ^ _DAT_004ccdb0;
                iVar249 = -(uint)(iVar66 < auVar189._0_4_);
                auVar160._4_4_ = -(uint)(iVar83 < auVar189._4_4_);
                iVar250 = -(uint)(iVar84 < auVar189._8_4_);
                auVar160._12_4_ = -(uint)(iVar251 < auVar189._12_4_);
                auVar222._4_4_ = iVar249;
                auVar222._0_4_ = iVar249;
                auVar222._8_4_ = iVar250;
                auVar222._12_4_ = iVar250;
                auVar185 = pshuflw(auVar185,auVar222,0xe8);
                auVar159._4_4_ = -(uint)(auVar189._4_4_ == iVar83);
                auVar159._12_4_ = -(uint)(auVar189._12_4_ == iVar251);
                auVar159._0_4_ = auVar159._4_4_;
                auVar159._8_4_ = auVar159._12_4_;
                auVar279 = pshuflw(auVar288 & auVar279,auVar159,0xe8);
                in_XMM12 = auVar279 & auVar185;
                auVar160._0_4_ = auVar160._4_4_;
                auVar160._8_4_ = auVar160._12_4_;
                auVar185 = pshuflw(auVar185,auVar160,0xe8);
                auVar271._8_4_ = 0xffffffff;
                auVar271._0_8_ = 0xffffffffffffffff;
                auVar271._12_4_ = 0xffffffff;
                auVar271 = (auVar185 | in_XMM12) ^ auVar271;
                in_XMM11 = packssdw(auVar271,auVar271);
                if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  left_data_2[__n_00 + uVar97 + 0x14] = uVar79;
                }
                auVar160 = auVar159 & auVar222 | auVar160;
                auVar185 = packssdw(auVar160,auVar160);
                auVar44._8_4_ = 0xffffffff;
                auVar44._0_8_ = 0xffffffffffffffff;
                auVar44._12_4_ = 0xffffffff;
                auVar185 = packssdw(auVar185 ^ auVar44,auVar185 ^ auVar44);
                if ((auVar185 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  left_data_2[__n_00 + uVar97 + 0x15] = uVar79;
                }
                auVar185 = (auVar124 | _DAT_004ce950) ^ _DAT_004ccdb0;
                iVar66 = -(uint)(iVar66 < auVar185._0_4_);
                auVar223._4_4_ = -(uint)(iVar83 < auVar185._4_4_);
                iVar84 = -(uint)(iVar84 < auVar185._8_4_);
                auVar223._12_4_ = -(uint)(iVar251 < auVar185._12_4_);
                auVar161._4_4_ = iVar66;
                auVar161._0_4_ = iVar66;
                auVar161._8_4_ = iVar84;
                auVar161._12_4_ = iVar84;
                auVar125._4_4_ = -(uint)(auVar185._4_4_ == iVar83);
                auVar125._12_4_ = -(uint)(auVar185._12_4_ == iVar251);
                auVar125._0_4_ = auVar125._4_4_;
                auVar125._8_4_ = auVar125._12_4_;
                auVar223._0_4_ = auVar223._4_4_;
                auVar223._8_4_ = auVar223._12_4_;
                auVar185 = auVar125 & auVar161 | auVar223;
                auVar185 = packssdw(auVar185,auVar185);
                auVar45._8_4_ = 0xffffffff;
                auVar45._0_8_ = 0xffffffffffffffff;
                auVar45._12_4_ = 0xffffffff;
                auVar185 = packssdw(auVar185 ^ auVar45,auVar185 ^ auVar45);
                if ((auVar185 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  left_data_2[__n_00 + uVar97 + 0x16] = uVar79;
                }
                auVar279 = pshufhw(auVar161,auVar161,0x84);
                auVar185 = pshufhw(auVar125,auVar125,0x84);
                auVar288 = pshufhw(auVar279,auVar223,0x84);
                auVar46._8_4_ = 0xffffffff;
                auVar46._0_8_ = 0xffffffffffffffff;
                auVar46._12_4_ = 0xffffffff;
                auVar185 = packssdw(auVar185 & auVar279,(auVar288 | auVar185 & auVar279) ^ auVar46);
                if ((auVar185 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  left_data_2[__n_00 + uVar97 + 0x17] = uVar79;
                }
                uVar97 = uVar97 + 8;
              } while (((long)(int)(uVar105 - local_bd0) + 7U & 0xfffffffffffffff8) != uVar97);
            }
          }
        }
        if ((bVar101 & 0x10) != 0) {
          if (((int)local_bd0 < 1) || ((int)uVar106 < 1)) {
            if ((int)local_bd0 < 1) {
              left_data_2[0xf] = uVar78;
              if (0 < (int)uVar106) {
                left_data_2[0xf] = *puVar90;
              }
            }
            else {
              left_data_2[0xf] = *puVar76;
            }
          }
          else {
            left_data_2[0xf] = puVar76[-1];
          }
          left_data[0xf] = left_data_2[0xf];
        }
        if (mode == '\0') {
          pap_Var61 = dc_pred_high[0 < (int)uVar106] + (0 < (int)local_bd0);
        }
        else {
          pap_Var61 = pred_high + uVar74;
        }
        (*(*pap_Var61)[uVar88])(puVar68,(long)dst_stride,left_data_2 + 0x10,left_data + 0x10,iVar82)
        ;
        return;
      }
      if ((bVar101 & 2) == 0) {
        if ((int)uVar106 < 1) {
          uVar79 = uVar78 - 1;
        }
        else {
          uVar79 = *puVar90;
        }
      }
      else if ((int)local_bd0 < 1) {
        uVar79 = uVar78 | 1;
      }
      else {
        uVar79 = *puVar76;
      }
      uVar105 = 1;
      if (1 < (int)uVar87) {
        uVar105 = uVar87;
      }
      lVar77 = __n - 1;
      auVar114._8_4_ = (int)lVar77;
      auVar114._0_8_ = lVar77;
      auVar114._12_4_ = (int)((ulong)lVar77 >> 0x20);
      uVar87 = 0;
      auVar114 = auVar114 ^ _DAT_004ccdb0;
      do {
        uVar88 = 0;
        do {
          auVar287._8_4_ = (int)uVar88;
          auVar287._0_8_ = uVar88;
          auVar287._12_4_ = (int)(uVar88 >> 0x20);
          auVar274 = (auVar287 | auVar279) ^ auVar288;
          iVar82 = auVar114._0_4_;
          iVar251 = -(uint)(iVar82 < auVar274._0_4_);
          iVar66 = auVar114._4_4_;
          auVar173._4_4_ = -(uint)(iVar66 < auVar274._4_4_);
          iVar83 = auVar114._8_4_;
          iVar249 = -(uint)(iVar83 < auVar274._8_4_);
          iVar84 = auVar114._12_4_;
          auVar173._12_4_ = -(uint)(iVar84 < auVar274._12_4_);
          auVar230._4_4_ = iVar251;
          auVar230._0_4_ = iVar251;
          auVar230._8_4_ = iVar249;
          auVar230._12_4_ = iVar249;
          auVar267 = pshuflw(in_XMM11,auVar230,0xe8);
          auVar172._4_4_ = -(uint)(auVar274._4_4_ == iVar66);
          auVar172._12_4_ = -(uint)(auVar274._12_4_ == iVar84);
          auVar172._0_4_ = auVar172._4_4_;
          auVar172._8_4_ = auVar172._12_4_;
          auVar286 = pshuflw(in_XMM12,auVar172,0xe8);
          auVar173._0_4_ = auVar173._4_4_;
          auVar173._8_4_ = auVar173._12_4_;
          auVar268 = pshuflw(auVar267,auVar173,0xe8);
          auVar274._8_4_ = 0xffffffff;
          auVar274._0_8_ = 0xffffffffffffffff;
          auVar274._12_4_ = 0xffffffff;
          auVar274 = (auVar268 | auVar286 & auVar267) ^ auVar274;
          auVar274 = packssdw(auVar274,auVar274);
          if ((auVar274 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar68[uVar88] = uVar79;
          }
          auVar173 = auVar172 & auVar230 | auVar173;
          auVar274 = packssdw(auVar173,auVar173);
          auVar268._8_4_ = 0xffffffff;
          auVar268._0_8_ = 0xffffffffffffffff;
          auVar268._12_4_ = 0xffffffff;
          auVar274 = packssdw(auVar274 ^ auVar268,auVar274 ^ auVar268);
          if ((auVar274._0_4_ >> 0x10 & 1) != 0) {
            puVar68[uVar88 + 1] = uVar79;
          }
          auVar274 = (auVar287 | auVar185) ^ auVar288;
          iVar251 = -(uint)(iVar82 < auVar274._0_4_);
          auVar254._4_4_ = -(uint)(iVar66 < auVar274._4_4_);
          iVar249 = -(uint)(iVar83 < auVar274._8_4_);
          auVar254._12_4_ = -(uint)(iVar84 < auVar274._12_4_);
          auVar145._4_4_ = iVar251;
          auVar145._0_4_ = iVar251;
          auVar145._8_4_ = iVar249;
          auVar145._12_4_ = iVar249;
          auVar213._4_4_ = -(uint)(auVar274._4_4_ == iVar66);
          auVar213._12_4_ = -(uint)(auVar274._12_4_ == iVar84);
          auVar213._0_4_ = auVar213._4_4_;
          auVar213._8_4_ = auVar213._12_4_;
          auVar254._0_4_ = auVar254._4_4_;
          auVar254._8_4_ = auVar254._12_4_;
          auVar274 = auVar213 & auVar145 | auVar254;
          auVar274 = packssdw(auVar274,auVar274);
          auVar57._8_4_ = 0xffffffff;
          auVar57._0_8_ = 0xffffffffffffffff;
          auVar57._12_4_ = 0xffffffff;
          auVar274 = packssdw(auVar274 ^ auVar57,auVar274 ^ auVar57);
          if ((auVar274 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar68[uVar88 + 2] = uVar79;
          }
          auVar172 = pshufhw(auVar145,auVar145,0x84);
          auVar230 = pshufhw(auVar213,auVar213,0x84);
          auVar173 = pshufhw(auVar172,auVar254,0x84);
          auVar146._8_4_ = 0xffffffff;
          auVar146._0_8_ = 0xffffffffffffffff;
          auVar146._12_4_ = 0xffffffff;
          auVar146 = (auVar173 | auVar230 & auVar172) ^ auVar146;
          auVar172 = packssdw(auVar146,auVar146);
          if ((auVar172 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar68[uVar88 + 3] = uVar79;
          }
          auVar172 = (auVar287 | auVar190) ^ auVar288;
          iVar251 = -(uint)(iVar82 < auVar172._0_4_);
          auVar148._4_4_ = -(uint)(iVar66 < auVar172._4_4_);
          iVar249 = -(uint)(iVar83 < auVar172._8_4_);
          auVar148._12_4_ = -(uint)(iVar84 < auVar172._12_4_);
          auVar214._4_4_ = iVar251;
          auVar214._0_4_ = iVar251;
          auVar214._8_4_ = iVar249;
          auVar214._12_4_ = iVar249;
          auVar274 = pshuflw(auVar274,auVar214,0xe8);
          auVar147._4_4_ = -(uint)(auVar172._4_4_ == iVar66);
          auVar147._12_4_ = -(uint)(auVar172._12_4_ == iVar84);
          auVar147._0_4_ = auVar147._4_4_;
          auVar147._8_4_ = auVar147._12_4_;
          auVar172 = pshuflw(auVar286 & auVar267,auVar147,0xe8);
          in_XMM12 = auVar172 & auVar274;
          auVar148._0_4_ = auVar148._4_4_;
          auVar148._8_4_ = auVar148._12_4_;
          auVar274 = pshuflw(auVar274,auVar148,0xe8);
          auVar267._8_4_ = 0xffffffff;
          auVar267._0_8_ = 0xffffffffffffffff;
          auVar267._12_4_ = 0xffffffff;
          auVar267 = (auVar274 | in_XMM12) ^ auVar267;
          in_XMM11 = packssdw(auVar267,auVar267);
          if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar68[uVar88 + 4] = uVar79;
          }
          auVar148 = auVar147 & auVar214 | auVar148;
          auVar274 = packssdw(auVar148,auVar148);
          auVar286._8_4_ = 0xffffffff;
          auVar286._0_8_ = 0xffffffffffffffff;
          auVar286._12_4_ = 0xffffffff;
          auVar274 = packssdw(auVar274 ^ auVar286,auVar274 ^ auVar286);
          if ((auVar274 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar68[uVar88 + 5] = uVar79;
          }
          auVar274 = (auVar287 | auVar189) ^ auVar288;
          iVar82 = -(uint)(iVar82 < auVar274._0_4_);
          auVar215._4_4_ = -(uint)(iVar66 < auVar274._4_4_);
          iVar83 = -(uint)(iVar83 < auVar274._8_4_);
          auVar215._12_4_ = -(uint)(iVar84 < auVar274._12_4_);
          auVar149._4_4_ = iVar82;
          auVar149._0_4_ = iVar82;
          auVar149._8_4_ = iVar83;
          auVar149._12_4_ = iVar83;
          auVar122._4_4_ = -(uint)(auVar274._4_4_ == iVar66);
          auVar122._12_4_ = -(uint)(auVar274._12_4_ == iVar84);
          auVar122._0_4_ = auVar122._4_4_;
          auVar122._8_4_ = auVar122._12_4_;
          auVar215._0_4_ = auVar215._4_4_;
          auVar215._8_4_ = auVar215._12_4_;
          auVar274 = auVar122 & auVar149 | auVar215;
          auVar274 = packssdw(auVar274,auVar274);
          auVar58._8_4_ = 0xffffffff;
          auVar58._0_8_ = 0xffffffffffffffff;
          auVar58._12_4_ = 0xffffffff;
          auVar274 = packssdw(auVar274 ^ auVar58,auVar274 ^ auVar58);
          if ((auVar274 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar68[uVar88 + 6] = uVar79;
          }
          auVar287 = pshufhw(auVar149,auVar149,0x84);
          auVar274 = pshufhw(auVar122,auVar122,0x84);
          auVar172 = pshufhw(auVar287,auVar215,0x84);
          auVar59._8_4_ = 0xffffffff;
          auVar59._0_8_ = 0xffffffffffffffff;
          auVar59._12_4_ = 0xffffffff;
          auVar274 = packssdw(auVar274 & auVar287,(auVar172 | auVar274 & auVar287) ^ auVar59);
          if ((auVar274 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar68[uVar88 + 7] = uVar79;
          }
          uVar88 = uVar88 + 8;
        } while ((__n + 7 & 0xfffffffffffffff8) != uVar88);
        uVar87 = uVar87 + 1;
        puVar68 = puVar68 + dst_stride;
      } while (uVar87 != uVar105);
      return;
    }
    pbVar102 = ref + -lVar77;
    pbVar107 = ref + -1;
    bVar101 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[uVar74];
    if (((bVar101 & 4) == 0 && uVar106 == 0) || ((bVar101 & 2) == 0 && local_bd0 == 0)) {
      if ((bVar101 & 2) == 0) {
        pbVar102 = pbVar107;
        if ((int)uVar106 < 1) {
          bVar101 = 0x7f;
          goto LAB_0039f6b5;
        }
      }
      else if ((int)local_bd0 < 1) {
        bVar101 = 0x81;
        goto LAB_0039f6b5;
      }
      bVar101 = *pbVar102;
LAB_0039f6b5:
      uVar105 = 1;
      if (1 < (int)uVar87) {
        uVar105 = uVar87;
      }
      do {
        memset(dst,(uint)bVar101,__n);
        dst = dst + dst_stride;
        uVar105 = uVar105 - 1;
      } while (uVar105 != 0);
      return;
    }
    if ((bVar101 & 2) != 0) {
      memset(left_data,0x81,0xa0);
      if ((int)uVar106 < 1) {
        if (0 < (int)local_bd0) {
          bVar103 = *pbVar102;
          puVar90 = left_data + 8;
          goto LAB_0039f9d0;
        }
      }
      else {
        uVar99 = 0;
        pbVar85 = pbVar107;
        do {
          uVar67 = uVar99;
          *(byte *)((long)left_data + uVar67 + 0x10) = *pbVar85;
          uVar99 = uVar67 + 1;
          pbVar85 = pbVar85 + lVar77;
        } while (uVar97 != uVar99);
        if ((int)uVar99 < (int)uVar87) {
          puVar90 = (uint16_t *)((long)left_data + uVar67 + 0x11);
          __n_01 = __n_01 - uVar99;
          bVar103 = *(byte *)((long)left_data + uVar67 + 0x10);
LAB_0039f9d0:
          memset(puVar90,(uint)bVar103,__n_01);
        }
      }
    }
    if ((bVar101 & 4) != 0) {
      memset(left_data_2,0x7f,0xa0);
      if ((int)local_bd0 < 1) {
        puVar90 = left_data_2 + 8;
        if (0 < (int)uVar106) {
          bVar103 = *pbVar107;
          goto LAB_003a00aa;
        }
      }
      else {
        memcpy(left_data_2 + 8,pbVar102,__n_00);
        if ((int)local_bd0 < (int)uVar105) {
          puVar90 = (uint16_t *)((long)left_data_2 + __n_00 + 0x10);
          __n = (size_t)(int)(uVar105 - local_bd0);
          bVar103 = *(byte *)((long)left_data_2 + __n_00 + 0xf);
LAB_003a00aa:
          memset(puVar90,(uint)bVar103,__n);
        }
      }
    }
    if ((bVar101 & 0x10) != 0) {
      if (((int)local_bd0 < 1) || ((int)uVar106 < 1)) {
        if (((int)local_bd0 < 1) &&
           (left_data_2[7]._1_1_ = 0x80, pbVar102 = pbVar107,
           left_data[7]._1_1_ = left_data_2[7]._1_1_, (int)uVar106 < 1)) goto LAB_003a0100;
      }
      else {
        pbVar102 = pbVar102 + -1;
      }
      left_data_2[7]._1_1_ = *pbVar102;
      left_data[7]._1_1_ = left_data_2[7]._1_1_;
    }
LAB_003a0100:
    if (mode == '\0') {
      pap_Var60 = dc_pred[0 < (int)uVar106] + (0 < (int)local_bd0);
    }
    else {
      pap_Var60 = pred + uVar74;
    }
    (*(*pap_Var60)[uVar88])
              (dst,(long)dst_stride,(uint8_t *)(left_data_2 + 8),(uint8_t *)(left_data + 8));
    return;
  }
  uVar95 = uVar95 - uVar87;
  uVar91 = -xd->mb_to_top_edge >> 5;
  uVar96 = tx_size_wide_unit[uVar88] + col_off;
  if ((int)uVar95 < 1) {
    bVar108 = false;
  }
  else {
    bVar108 = (int)((tx_size_high_unit[uVar88] + row_off << (bVar2 & 0x1f)) + uVar91) <
              (xd->tile).mi_row_end;
  }
  BVar1 = pMVar9->bsize;
  local_bbc = (uint)BVar1;
  if (iVar82 != 0 || uVar98 != 0) {
    uVar92 = (uint)BVar1;
    if (BVar1 < BLOCK_8X4) {
      if (BVar1 == BLOCK_4X4) {
        uVar92 = (uint)BVar1;
        if (uVar98 == 1) {
          uVar92 = uVar98;
        }
        bVar109 = uVar98 == 1 && iVar82 == 1;
        goto LAB_0039f2db;
      }
      if (BVar1 == BLOCK_4X8) {
        if (uVar98 == 1) {
          uVar92 = uVar98;
        }
        local_bbc = 3;
        goto LAB_0039f2df;
      }
    }
    else {
      uVar65 = (uint)BVar1;
      if (uVar65 == 2) {
        uVar92 = uVar65;
        if (uVar98 == 1) {
          uVar92 = 3;
        }
        bVar109 = uVar98 == 1 && iVar82 == 1;
LAB_0039f2db:
        local_bbc = (uint)(bVar109 | 2);
      }
      else if (uVar65 == 0x10) {
        uVar92 = uVar65;
        if (uVar98 == 1) {
          uVar92 = 0x10;
        }
        local_bbc = 4;
      }
      else {
        if (BVar1 != BLOCK_16X4) goto LAB_0039f2e7;
        local_bbc = 0x11;
        if (uVar98 == 1) {
          local_bbc = 5;
          uVar92 = 5;
        }
        if (iVar82 != 1) {
          local_bbc = 0x11;
        }
      }
LAB_0039f2df:
      if (iVar82 != 1) {
        local_bbc = uVar92;
      }
    }
  }
LAB_0039f2e7:
  bVar63 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[uVar74];
  bVar81 = bVar63 & 0x20;
  if (filter_intra_mode != '\x05') {
    bVar81 = 0;
  }
  uVar98 = 0;
  bVar69 = bVar63 & 8;
  if (filter_intra_mode != '\x05') {
    bVar69 = 0;
  }
  if ((byte)(mode - 1) < 8) {
    uVar98 = (uint)""[uVar74] + angle_delta;
    bVar69 = (int)uVar98 < 0x5a;
    bVar81 = 0xb4 < (int)uVar98;
  }
  uVar92 = -xd->mb_to_left_edge >> 5;
  sVar80 = 0xffffffff;
  if ((bVar69 != 0) &&
     (sVar80 = 0,
     cVar62 == '\x01' && (int)((uVar96 << (bVar103 & 0x1f)) + uVar92) < (xd->tile).mi_col_end)) {
    uVar73 = local_bbc & 0xff;
    uVar65 = (uint)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [uVar73] >> (bVar103 & 0x1f));
    iVar82 = uVar65 + (uVar65 == 0);
    if (row_off < 1) {
      sVar80 = 1;
      if (iVar82 <= (int)uVar96) {
        uVar96 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [sb_size] - 1;
        iVar66 = (int)(uVar96 & uVar91) >> (""[uVar73] & 0x1f);
        bVar69 = ""[uVar73];
        iVar82 = (int)(uVar96 & uVar92) >> (bVar69 & 0x1f);
        if ((iVar66 != 0) &&
           (sVar80 = 0,
           iVar82 + 1 << (bVar69 & 0x1f) <
           (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                      [sb_size])) {
          iVar66 = iVar66 << (5 - bVar69 & 0x1f);
          uVar65 = iVar66 + iVar82;
          uVar96 = iVar66 + 7 + iVar82;
          if (-1 < (int)uVar65) {
            uVar96 = uVar65;
          }
          ppuVar93 = has_tr_tables;
          if ((pMVar9->partition & 0xfe) == 6) {
            ppuVar93 = has_tr_vert_tables;
          }
          sVar80 = (size_t)((ppuVar93[uVar73][(int)uVar96 >> 3] >> (uVar65 & 7) & 1) != 0);
        }
      }
    }
    else {
      if (((byte)local_bbc & 0xfe) == 0xe) {
        sVar80 = 1;
        if (uVar96 == 0x10U >> (bVar103 & 0x1f) && 0x10U >> (bVar2 & 0x1f) == row_off)
        goto LAB_0039f4f9;
        uVar96 = 0x10 >> (bVar103 & 0x1f);
        iVar82 = col_off % (int)uVar96 + tx_size_wide_unit[uVar88];
        bVar109 = SBORROW4(iVar82,uVar96);
        iVar82 = iVar82 - uVar96;
      }
      else {
        bVar109 = SBORROW4(uVar96,iVar82);
        iVar82 = uVar96 - iVar82;
      }
      sVar80 = (size_t)(bVar109 != iVar82 < 0);
    }
  }
LAB_0039f4f9:
  uVar96 = 0xffffffff;
  if ((bVar81 != 0) && (uVar96 = 0, (bVar101 & bVar108) == 1)) {
    uVar65 = local_bbc & 0xff;
    if ((col_off < 1) || (((byte)local_bbc & 0xfe) != 0xe)) {
      if (col_off < 1) {
        uVar73 = (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                        [uVar65] >> (bVar2 & 0x1f));
        uVar96 = 1;
        if ((int)(uVar73 + (uVar73 == 0)) <= row_off + tx_size_high_unit[uVar88]) {
          bVar101 = ""[uVar65];
          bVar103 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [sb_size];
          iVar66 = (int)(uVar91 & bVar103 - 1) >> (bVar101 & 0x1f);
          iVar82 = (int)(uVar92 & bVar103 - 1) >> (""[uVar65] & 0x1f);
          if (iVar82 == 0) {
            uVar96 = (uint)(((iVar66 << (bVar101 & 0x1f)) >> (bVar2 & 0x1f)) +
                            row_off + tx_size_high_unit[uVar88] <
                           (int)(uint)(bVar103 >> (bVar2 & 0x1f)));
          }
          else {
            uVar96 = 0;
            if (iVar66 + 1 << (bVar101 & 0x1f) < (int)(uint)bVar103) {
              iVar66 = iVar66 << (5 - ""[uVar65] & 0x1f);
              uVar96 = iVar66 + iVar82;
              uVar91 = iVar66 + 7 + iVar82;
              if (-1 < (int)uVar96) {
                uVar91 = uVar96;
              }
              ppuVar93 = has_bl_tables;
              if ((pMVar9->partition & 0xfe) == 6) {
                ppuVar93 = has_bl_vert_tables;
              }
              uVar96 = (uint)((ppuVar93[uVar65][(int)uVar91 >> 3] >> (uVar96 & 7) & 1) != 0);
            }
          }
        }
      }
    }
    else {
      uVar96 = 0;
      if (((0x10U >> (bVar103 & 0x1f)) + 0x7fffffff & col_off) == 0) {
        uVar96 = 0x10 >> (bVar2 & 0x1f);
        uVar91 = (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                        [uVar65] >> (bVar2 & 0x1f));
        if (uVar96 <= uVar91) {
          uVar91 = uVar96;
        }
        uVar96 = (uint)(row_off % (int)uVar96 + tx_size_high_unit[uVar88] < (int)uVar91);
      }
    }
  }
  psVar10 = xd->block_ref_scale_factors[(ulong)(plane != 0) * 2 + -8];
  psVar11 = xd->block_ref_scale_factors[(ulong)(plane != 0) * 2 + -7];
  if (psVar11 == (scale_factors *)0x0) {
LAB_003a0593:
    if (psVar10 == (scale_factors *)0x0) {
      uVar91 = 0;
    }
    else {
      if (plane == 0) {
        cVar62 = *(undefined1 *)((long)&psVar10->x_scale_fp + 2);
LAB_003a05bc:
        bVar108 = (byte)(cVar62 - 9U) < 3;
      }
      else {
        if (((int)(psVar10[10].y_scale_fp & -0x80000000) == 0) &&
           ((char)psVar10[1].x_scale_fp < '\x01')) {
          cVar62 = *(undefined1 *)((long)&psVar10->x_scale_fp + 3);
          goto LAB_003a05bc;
        }
        bVar108 = false;
      }
      uVar91 = (uint)bVar108;
    }
  }
  else {
    if (plane == 0) {
      lVar77 = 2;
    }
    else {
      if (((int)(psVar11[10].y_scale_fp & -0x80000000) != 0) || ('\0' < (char)psVar11[1].x_scale_fp)
         ) goto LAB_003a0593;
      lVar77 = 3;
    }
    uVar91 = 1;
    if (2 < (byte)(*(char *)((long)&psVar11->x_scale_fp + lVar77) - 9U)) goto LAB_003a0593;
  }
  uVar74 = (ulong)(uVar64 - uVar105);
  if ((int)uVar105 < (int)(uVar64 - uVar105)) {
    uVar74 = __n;
  }
  uVar74 = uVar74 & 0xffffffff;
  if ((int)sVar80 < 1) {
    uVar74 = sVar80;
  }
  if ((int)uVar87 < (int)uVar95) {
    uVar95 = uVar87;
  }
  if ((int)uVar96 < 1) {
    uVar95 = uVar96;
  }
  iVar82 = (int)uVar74;
  if ((uVar104 & 1) != 0) {
    uVar104 = xd->bd;
    lVar77 = (long)ref * 2;
    lVar75 = (long)ref_stride;
    iVar66 = 0x80 << ((char)uVar104 - 8U & 0x1f);
    uVar64 = iVar66 + 1;
    auVar114 = pshuflw(ZEXT416(uVar64),ZEXT416(uVar64),0);
    uVar110 = auVar114._0_4_;
    lVar72 = 0;
    do {
      *(undefined4 *)(left_data_2 + lVar72) = uVar110;
      *(undefined4 *)(left_data_2 + lVar72 + 2) = uVar110;
      *(undefined4 *)(left_data_2 + lVar72 + 4) = uVar110;
      *(undefined4 *)(left_data_2 + lVar72 + 6) = uVar110;
      lVar72 = lVar72 + 8;
    } while (lVar72 != 0xa0);
    dst = (uint8_t *)((long)dst * 2);
    bVar101 = bVar63 & 4;
    bVar103 = bVar63 & 2;
    uVar96 = iVar66 - 1;
    auVar114 = pshuflw(ZEXT416(uVar96),ZEXT416(uVar96),0);
    uVar110 = auVar114._0_4_;
    lVar72 = 0;
    do {
      lVar94 = lVar72 * 2;
      *(undefined4 *)((long)auStack_9f8 + lVar94) = uVar110;
      *(undefined4 *)((long)auStack_9f8 + lVar94 + 4) = uVar110;
      *(undefined4 *)((long)auStack_9f8 + lVar94 + 8) = uVar110;
      *(undefined4 *)((long)auStack_9f8 + lVar94 + 0xc) = uVar110;
      lVar72 = lVar72 + 8;
    } while (lVar72 != 0xa0);
    if ((byte)(mode - 9) < 0xf8) {
      bVar63 = bVar63 & 0x10;
    }
    else if ((int)uVar98 < 0x5b) {
      bVar103 = 0;
      bVar63 = 1;
      bVar101 = 1;
    }
    else {
      bVar101 = (int)uVar98 < 0xb4;
      bVar63 = 1;
      bVar103 = 1;
    }
    puVar90 = (uint16_t *)(lVar77 + -2);
    puVar68 = (uint16_t *)(lVar77 + lVar75 * -2);
    if (filter_intra_mode != '\x05') {
      bVar101 = 1;
      bVar103 = 1;
    }
    if ((bVar101 == 0 && uVar106 == 0) || (bVar103 == 0 && local_bd0 == 0)) {
      if (bVar103 != 0) {
        uVar96 = uVar64;
        puVar90 = puVar68;
        uVar106 = local_bd0;
      }
      uVar79 = (uint16_t)uVar96;
      if (0 < (int)uVar106) {
        uVar79 = *puVar90;
      }
      uVar105 = 1;
      if (1 < (int)uVar87) {
        uVar105 = uVar87;
      }
      lVar77 = __n - 1;
      auVar115._8_4_ = (int)lVar77;
      auVar115._0_8_ = lVar77;
      auVar115._12_4_ = (int)((ulong)lVar77 >> 0x20);
      uVar87 = 0;
      auVar115 = auVar115 ^ _DAT_004ccdb0;
      do {
        uVar88 = 0;
        do {
          auVar128._8_4_ = (int)uVar88;
          auVar128._0_8_ = uVar88;
          auVar128._12_4_ = (int)(uVar88 >> 0x20);
          auVar114 = (auVar128 | auVar279) ^ auVar288;
          iVar82 = auVar115._0_4_;
          iVar251 = -(uint)(iVar82 < auVar114._0_4_);
          iVar66 = auVar115._4_4_;
          auVar170._4_4_ = -(uint)(iVar66 < auVar114._4_4_);
          iVar83 = auVar115._8_4_;
          iVar249 = -(uint)(iVar83 < auVar114._8_4_);
          iVar84 = auVar115._12_4_;
          auVar170._12_4_ = -(uint)(iVar84 < auVar114._12_4_);
          auVar228._4_4_ = iVar251;
          auVar228._0_4_ = iVar251;
          auVar228._8_4_ = iVar249;
          auVar228._12_4_ = iVar249;
          auVar274 = pshuflw(in_XMM11,auVar228,0xe8);
          auVar169._4_4_ = -(uint)(auVar114._4_4_ == iVar66);
          auVar169._12_4_ = -(uint)(auVar114._12_4_ == iVar84);
          auVar169._0_4_ = auVar169._4_4_;
          auVar169._8_4_ = auVar169._12_4_;
          auVar287 = pshuflw(in_XMM12,auVar169,0xe8);
          auVar170._0_4_ = auVar170._4_4_;
          auVar170._8_4_ = auVar170._12_4_;
          auVar114 = pshuflw(auVar274,auVar170,0xe8);
          auVar275._8_4_ = 0xffffffff;
          auVar275._0_8_ = 0xffffffffffffffff;
          auVar275._12_4_ = 0xffffffff;
          auVar275 = (auVar114 | auVar287 & auVar274) ^ auVar275;
          auVar114 = packssdw(auVar275,auVar275);
          if ((auVar114 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + uVar88 * 2) = uVar79;
          }
          auVar170 = auVar169 & auVar228 | auVar170;
          auVar114 = packssdw(auVar170,auVar170);
          auVar32._8_4_ = 0xffffffff;
          auVar32._0_8_ = 0xffffffffffffffff;
          auVar32._12_4_ = 0xffffffff;
          auVar114 = packssdw(auVar114 ^ auVar32,auVar114 ^ auVar32);
          if ((auVar114._0_4_ >> 0x10 & 1) != 0) {
            *(uint16_t *)((long)dst + (uVar88 + 1) * 2) = uVar79;
          }
          auVar114 = (auVar128 | auVar185) ^ auVar288;
          iVar251 = -(uint)(iVar82 < auVar114._0_4_);
          auVar258._4_4_ = -(uint)(iVar66 < auVar114._4_4_);
          iVar249 = -(uint)(iVar83 < auVar114._8_4_);
          auVar258._12_4_ = -(uint)(iVar84 < auVar114._12_4_);
          auVar171._4_4_ = iVar251;
          auVar171._0_4_ = iVar251;
          auVar171._8_4_ = iVar249;
          auVar171._12_4_ = iVar249;
          auVar229._4_4_ = -(uint)(auVar114._4_4_ == iVar66);
          auVar229._12_4_ = -(uint)(auVar114._12_4_ == iVar84);
          auVar229._0_4_ = auVar229._4_4_;
          auVar229._8_4_ = auVar229._12_4_;
          auVar258._0_4_ = auVar258._4_4_;
          auVar258._8_4_ = auVar258._12_4_;
          auVar114 = auVar229 & auVar171 | auVar258;
          auVar114 = packssdw(auVar114,auVar114);
          auVar33._8_4_ = 0xffffffff;
          auVar33._0_8_ = 0xffffffffffffffff;
          auVar33._12_4_ = 0xffffffff;
          auVar114 = packssdw(auVar114 ^ auVar33,auVar114 ^ auVar33);
          if ((auVar114 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + (uVar88 + 2) * 2) = uVar79;
          }
          auVar172 = pshufhw(auVar171,auVar171,0x84);
          auVar230 = pshufhw(auVar229,auVar229,0x84);
          auVar173 = pshufhw(auVar172,auVar258,0x84);
          auVar174._8_4_ = 0xffffffff;
          auVar174._0_8_ = 0xffffffffffffffff;
          auVar174._12_4_ = 0xffffffff;
          auVar174 = (auVar173 | auVar230 & auVar172) ^ auVar174;
          auVar172 = packssdw(auVar174,auVar174);
          if ((auVar172 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + (uVar88 + 3) * 2) = uVar79;
          }
          auVar172 = (auVar128 | auVar190) ^ auVar288;
          iVar251 = -(uint)(iVar82 < auVar172._0_4_);
          auVar176._4_4_ = -(uint)(iVar66 < auVar172._4_4_);
          iVar249 = -(uint)(iVar83 < auVar172._8_4_);
          auVar176._12_4_ = -(uint)(iVar84 < auVar172._12_4_);
          auVar231._4_4_ = iVar251;
          auVar231._0_4_ = iVar251;
          auVar231._8_4_ = iVar249;
          auVar231._12_4_ = iVar249;
          auVar114 = pshuflw(auVar114,auVar231,0xe8);
          auVar175._4_4_ = -(uint)(auVar172._4_4_ == iVar66);
          auVar175._12_4_ = -(uint)(auVar172._12_4_ == iVar84);
          auVar175._0_4_ = auVar175._4_4_;
          auVar175._8_4_ = auVar175._12_4_;
          auVar274 = pshuflw(auVar287 & auVar274,auVar175,0xe8);
          in_XMM12 = auVar274 & auVar114;
          auVar176._0_4_ = auVar176._4_4_;
          auVar176._8_4_ = auVar176._12_4_;
          auVar114 = pshuflw(auVar114,auVar176,0xe8);
          auVar276._8_4_ = 0xffffffff;
          auVar276._0_8_ = 0xffffffffffffffff;
          auVar276._12_4_ = 0xffffffff;
          auVar276 = (auVar114 | in_XMM12) ^ auVar276;
          in_XMM11 = packssdw(auVar276,auVar276);
          if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + (uVar88 + 4) * 2) = uVar79;
          }
          auVar176 = auVar175 & auVar231 | auVar176;
          auVar114 = packssdw(auVar176,auVar176);
          auVar34._8_4_ = 0xffffffff;
          auVar34._0_8_ = 0xffffffffffffffff;
          auVar34._12_4_ = 0xffffffff;
          auVar114 = packssdw(auVar114 ^ auVar34,auVar114 ^ auVar34);
          if ((auVar114 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + (uVar88 + 5) * 2) = uVar79;
          }
          auVar114 = (auVar128 | auVar189) ^ auVar288;
          iVar82 = -(uint)(iVar82 < auVar114._0_4_);
          auVar232._4_4_ = -(uint)(iVar66 < auVar114._4_4_);
          iVar83 = -(uint)(iVar83 < auVar114._8_4_);
          auVar232._12_4_ = -(uint)(iVar84 < auVar114._12_4_);
          auVar177._4_4_ = iVar82;
          auVar177._0_4_ = iVar82;
          auVar177._8_4_ = iVar83;
          auVar177._12_4_ = iVar83;
          auVar129._4_4_ = -(uint)(auVar114._4_4_ == iVar66);
          auVar129._12_4_ = -(uint)(auVar114._12_4_ == iVar84);
          auVar129._0_4_ = auVar129._4_4_;
          auVar129._8_4_ = auVar129._12_4_;
          auVar232._0_4_ = auVar232._4_4_;
          auVar232._8_4_ = auVar232._12_4_;
          auVar114 = auVar129 & auVar177 | auVar232;
          auVar114 = packssdw(auVar114,auVar114);
          auVar35._8_4_ = 0xffffffff;
          auVar35._0_8_ = 0xffffffffffffffff;
          auVar35._12_4_ = 0xffffffff;
          auVar114 = packssdw(auVar114 ^ auVar35,auVar114 ^ auVar35);
          if ((auVar114 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + (uVar88 + 6) * 2) = uVar79;
          }
          auVar274 = pshufhw(auVar177,auVar177,0x84);
          auVar114 = pshufhw(auVar129,auVar129,0x84);
          auVar287 = pshufhw(auVar274,auVar232,0x84);
          auVar36._8_4_ = 0xffffffff;
          auVar36._0_8_ = 0xffffffffffffffff;
          auVar36._12_4_ = 0xffffffff;
          auVar114 = packssdw(auVar114 & auVar274,(auVar287 | auVar114 & auVar274) ^ auVar36);
          if ((auVar114 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + (uVar88 + 7) * 2) = uVar79;
          }
          uVar88 = uVar88 + 8;
        } while ((__n + 7 & 0xfffffffffffffff8) != uVar88);
        uVar87 = uVar87 + 1;
        dst = (uint8_t *)((long)dst + (long)dst_stride * 2);
      } while (uVar87 != uVar105);
      return;
    }
    if (bVar103 != 0) {
      uVar64 = 0;
      if (-1 < (int)uVar95) {
        uVar64 = uVar105;
      }
      iVar83 = uVar64 + uVar87;
      if ((int)uVar106 < 1) {
        if ((0 < (int)local_bd0) && (iVar83 != 0)) {
          uVar79 = *puVar68;
          lVar77 = (long)iVar83 + -1;
          auVar116._8_4_ = (int)lVar77;
          auVar116._0_8_ = lVar77;
          auVar116._12_4_ = (int)((ulong)lVar77 >> 0x20);
          uVar74 = 0;
          auVar116 = auVar116 ^ _DAT_004ccdb0;
          do {
            auVar130._8_4_ = (int)uVar74;
            auVar130._0_8_ = uVar74;
            auVar130._12_4_ = (int)(uVar74 >> 0x20);
            auVar185 = (auVar130 | _DAT_004ccda0) ^ _DAT_004ccdb0;
            iVar84 = auVar116._0_4_;
            iVar264 = -(uint)(iVar84 < auVar185._0_4_);
            iVar251 = auVar116._4_4_;
            auVar179._4_4_ = -(uint)(iVar251 < auVar185._4_4_);
            iVar249 = auVar116._8_4_;
            iVar252 = -(uint)(iVar249 < auVar185._8_4_);
            iVar250 = auVar116._12_4_;
            auVar179._12_4_ = -(uint)(iVar250 < auVar185._12_4_);
            auVar233._4_4_ = iVar264;
            auVar233._0_4_ = iVar264;
            auVar233._8_4_ = iVar252;
            auVar233._12_4_ = iVar252;
            auVar279 = pshuflw(in_XMM11,auVar233,0xe8);
            auVar178._4_4_ = -(uint)(auVar185._4_4_ == iVar251);
            auVar178._12_4_ = -(uint)(auVar185._12_4_ == iVar250);
            auVar178._0_4_ = auVar178._4_4_;
            auVar178._8_4_ = auVar178._12_4_;
            auVar288 = pshuflw(in_XMM12,auVar178,0xe8);
            auVar179._0_4_ = auVar179._4_4_;
            auVar179._8_4_ = auVar179._12_4_;
            auVar185 = pshuflw(auVar279,auVar179,0xe8);
            auVar277._8_4_ = 0xffffffff;
            auVar277._0_8_ = 0xffffffffffffffff;
            auVar277._12_4_ = 0xffffffff;
            auVar277 = (auVar185 | auVar288 & auVar279) ^ auVar277;
            auVar185 = packssdw(auVar277,auVar277);
            if ((auVar185 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              left_data_2[uVar74 + 0x10] = uVar79;
            }
            auVar179 = auVar178 & auVar233 | auVar179;
            auVar185 = packssdw(auVar179,auVar179);
            auVar27._8_4_ = 0xffffffff;
            auVar27._0_8_ = 0xffffffffffffffff;
            auVar27._12_4_ = 0xffffffff;
            auVar185 = packssdw(auVar185 ^ auVar27,auVar185 ^ auVar27);
            if ((auVar185._0_4_ >> 0x10 & 1) != 0) {
              left_data_2[uVar74 + 0x11] = uVar79;
            }
            auVar185 = (auVar130 | _DAT_004ccd90) ^ _DAT_004ccdb0;
            iVar264 = -(uint)(iVar84 < auVar185._0_4_);
            auVar259._4_4_ = -(uint)(iVar251 < auVar185._4_4_);
            iVar252 = -(uint)(iVar249 < auVar185._8_4_);
            auVar259._12_4_ = -(uint)(iVar250 < auVar185._12_4_);
            auVar180._4_4_ = iVar264;
            auVar180._0_4_ = iVar264;
            auVar180._8_4_ = iVar252;
            auVar180._12_4_ = iVar252;
            auVar234._4_4_ = -(uint)(auVar185._4_4_ == iVar251);
            auVar234._12_4_ = -(uint)(auVar185._12_4_ == iVar250);
            auVar234._0_4_ = auVar234._4_4_;
            auVar234._8_4_ = auVar234._12_4_;
            auVar259._0_4_ = auVar259._4_4_;
            auVar259._8_4_ = auVar259._12_4_;
            auVar185 = auVar234 & auVar180 | auVar259;
            auVar185 = packssdw(auVar185,auVar185);
            auVar28._8_4_ = 0xffffffff;
            auVar28._0_8_ = 0xffffffffffffffff;
            auVar28._12_4_ = 0xffffffff;
            auVar185 = packssdw(auVar185 ^ auVar28,auVar185 ^ auVar28);
            if ((auVar185 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              left_data_2[uVar74 + 0x12] = uVar79;
            }
            auVar189 = pshufhw(auVar180,auVar180,0x84);
            auVar114 = pshufhw(auVar234,auVar234,0x84);
            auVar190 = pshufhw(auVar189,auVar259,0x84);
            auVar181._8_4_ = 0xffffffff;
            auVar181._0_8_ = 0xffffffffffffffff;
            auVar181._12_4_ = 0xffffffff;
            auVar181 = (auVar190 | auVar114 & auVar189) ^ auVar181;
            auVar189 = packssdw(auVar181,auVar181);
            if ((auVar189 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              left_data_2[uVar74 + 0x13] = uVar79;
            }
            auVar189 = (auVar130 | _DAT_004ce960) ^ _DAT_004ccdb0;
            iVar264 = -(uint)(iVar84 < auVar189._0_4_);
            auVar183._4_4_ = -(uint)(iVar251 < auVar189._4_4_);
            iVar252 = -(uint)(iVar249 < auVar189._8_4_);
            auVar183._12_4_ = -(uint)(iVar250 < auVar189._12_4_);
            auVar235._4_4_ = iVar264;
            auVar235._0_4_ = iVar264;
            auVar235._8_4_ = iVar252;
            auVar235._12_4_ = iVar252;
            auVar185 = pshuflw(auVar185,auVar235,0xe8);
            auVar182._4_4_ = -(uint)(auVar189._4_4_ == iVar251);
            auVar182._12_4_ = -(uint)(auVar189._12_4_ == iVar250);
            auVar182._0_4_ = auVar182._4_4_;
            auVar182._8_4_ = auVar182._12_4_;
            auVar279 = pshuflw(auVar288 & auVar279,auVar182,0xe8);
            in_XMM12 = auVar279 & auVar185;
            auVar183._0_4_ = auVar183._4_4_;
            auVar183._8_4_ = auVar183._12_4_;
            auVar185 = pshuflw(auVar185,auVar183,0xe8);
            auVar278._8_4_ = 0xffffffff;
            auVar278._0_8_ = 0xffffffffffffffff;
            auVar278._12_4_ = 0xffffffff;
            auVar278 = (auVar185 | in_XMM12) ^ auVar278;
            in_XMM11 = packssdw(auVar278,auVar278);
            if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              left_data_2[uVar74 + 0x14] = uVar79;
            }
            auVar183 = auVar182 & auVar235 | auVar183;
            auVar185 = packssdw(auVar183,auVar183);
            auVar29._8_4_ = 0xffffffff;
            auVar29._0_8_ = 0xffffffffffffffff;
            auVar29._12_4_ = 0xffffffff;
            auVar185 = packssdw(auVar185 ^ auVar29,auVar185 ^ auVar29);
            if ((auVar185 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              left_data_2[uVar74 + 0x15] = uVar79;
            }
            auVar185 = (auVar130 | _DAT_004ce950) ^ _DAT_004ccdb0;
            iVar84 = -(uint)(iVar84 < auVar185._0_4_);
            auVar236._4_4_ = -(uint)(iVar251 < auVar185._4_4_);
            iVar249 = -(uint)(iVar249 < auVar185._8_4_);
            auVar236._12_4_ = -(uint)(iVar250 < auVar185._12_4_);
            auVar184._4_4_ = iVar84;
            auVar184._0_4_ = iVar84;
            auVar184._8_4_ = iVar249;
            auVar184._12_4_ = iVar249;
            auVar131._4_4_ = -(uint)(auVar185._4_4_ == iVar251);
            auVar131._12_4_ = -(uint)(auVar185._12_4_ == iVar250);
            auVar131._0_4_ = auVar131._4_4_;
            auVar131._8_4_ = auVar131._12_4_;
            auVar236._0_4_ = auVar236._4_4_;
            auVar236._8_4_ = auVar236._12_4_;
            auVar185 = auVar131 & auVar184 | auVar236;
            auVar185 = packssdw(auVar185,auVar185);
            auVar30._8_4_ = 0xffffffff;
            auVar30._0_8_ = 0xffffffffffffffff;
            auVar30._12_4_ = 0xffffffff;
            auVar185 = packssdw(auVar185 ^ auVar30,auVar185 ^ auVar30);
            if ((auVar185 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              left_data_2[uVar74 + 0x16] = uVar79;
            }
            auVar279 = pshufhw(auVar184,auVar184,0x84);
            auVar185 = pshufhw(auVar131,auVar131,0x84);
            auVar288 = pshufhw(auVar279,auVar236,0x84);
            auVar31._8_4_ = 0xffffffff;
            auVar31._0_8_ = 0xffffffffffffffff;
            auVar31._12_4_ = 0xffffffff;
            auVar185 = packssdw(auVar185 & auVar279,(auVar288 | auVar185 & auVar279) ^ auVar31);
            if ((auVar185 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              left_data_2[uVar74 + 0x17] = uVar79;
            }
            uVar74 = uVar74 + 8;
          } while (((long)iVar83 + 7U & 0xfffffffffffffff8) != uVar74);
        }
      }
      else {
        uVar74 = 0;
        puVar76 = puVar90;
        do {
          left_data_2[uVar74 + 0x10] = *puVar76;
          uVar74 = uVar74 + 1;
          puVar76 = puVar76 + lVar75;
        } while (uVar97 != uVar74);
        if ((0 < (int)uVar95) && ((int)uVar74 < (int)(uVar95 + uVar87))) {
          puVar76 = (uint16_t *)(lVar77 + lVar75 * uVar97 * 2 + -2);
          do {
            left_data_2[uVar97 + 0x10] = *puVar76;
            uVar97 = uVar97 + 1;
            puVar76 = puVar76 + lVar75;
          } while ((long)uVar97 < (long)(int)(uVar95 + uVar87));
          uVar74 = uVar97 & 0xffffffff;
        }
        iVar251 = (int)uVar74;
        iVar84 = iVar83 - iVar251;
        if (iVar84 != 0 && iVar251 <= iVar83) {
          uVar79 = left_data_2[(long)iVar251 + 0xf];
          lVar77 = (long)iVar84 + -1;
          auVar117._8_4_ = (int)lVar77;
          auVar117._0_8_ = lVar77;
          auVar117._12_4_ = (int)((ulong)lVar77 >> 0x20);
          uVar74 = 0;
          auVar117 = auVar117 ^ _DAT_004ccdb0;
          do {
            auVar132._8_4_ = (int)uVar74;
            auVar132._0_8_ = uVar74;
            auVar132._12_4_ = (int)(uVar74 >> 0x20);
            auVar185 = (auVar132 | _DAT_004ccda0) ^ _DAT_004ccdb0;
            iVar83 = auVar117._0_4_;
            iVar252 = -(uint)(iVar83 < auVar185._0_4_);
            iVar249 = auVar117._4_4_;
            auVar187._4_4_ = -(uint)(iVar249 < auVar185._4_4_);
            iVar250 = auVar117._8_4_;
            iVar263 = -(uint)(iVar250 < auVar185._8_4_);
            iVar264 = auVar117._12_4_;
            auVar187._12_4_ = -(uint)(iVar264 < auVar185._12_4_);
            auVar237._4_4_ = iVar252;
            auVar237._0_4_ = iVar252;
            auVar237._8_4_ = iVar263;
            auVar237._12_4_ = iVar263;
            auVar279 = pshuflw(in_XMM11,auVar237,0xe8);
            auVar186._4_4_ = -(uint)(auVar185._4_4_ == iVar249);
            auVar186._12_4_ = -(uint)(auVar185._12_4_ == iVar264);
            auVar186._0_4_ = auVar186._4_4_;
            auVar186._8_4_ = auVar186._12_4_;
            auVar288 = pshuflw(in_XMM12,auVar186,0xe8);
            auVar187._0_4_ = auVar187._4_4_;
            auVar187._8_4_ = auVar187._12_4_;
            auVar185 = pshuflw(auVar279,auVar187,0xe8);
            auVar280._8_4_ = 0xffffffff;
            auVar280._0_8_ = 0xffffffffffffffff;
            auVar280._12_4_ = 0xffffffff;
            auVar280 = (auVar185 | auVar288 & auVar279) ^ auVar280;
            auVar185 = packssdw(auVar280,auVar280);
            if ((auVar185 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              left_data_2[(long)iVar251 + uVar74 + 0x10] = uVar79;
            }
            auVar187 = auVar186 & auVar237 | auVar187;
            auVar185 = packssdw(auVar187,auVar187);
            auVar12._8_4_ = 0xffffffff;
            auVar12._0_8_ = 0xffffffffffffffff;
            auVar12._12_4_ = 0xffffffff;
            auVar185 = packssdw(auVar185 ^ auVar12,auVar185 ^ auVar12);
            if ((auVar185._0_4_ >> 0x10 & 1) != 0) {
              left_data_2[(long)iVar251 + uVar74 + 0x11] = uVar79;
            }
            auVar185 = (auVar132 | _DAT_004ccd90) ^ _DAT_004ccdb0;
            iVar252 = -(uint)(iVar83 < auVar185._0_4_);
            auVar260._4_4_ = -(uint)(iVar249 < auVar185._4_4_);
            iVar263 = -(uint)(iVar250 < auVar185._8_4_);
            auVar260._12_4_ = -(uint)(iVar264 < auVar185._12_4_);
            auVar188._4_4_ = iVar252;
            auVar188._0_4_ = iVar252;
            auVar188._8_4_ = iVar263;
            auVar188._12_4_ = iVar263;
            auVar238._4_4_ = -(uint)(auVar185._4_4_ == iVar249);
            auVar238._12_4_ = -(uint)(auVar185._12_4_ == iVar264);
            auVar238._0_4_ = auVar238._4_4_;
            auVar238._8_4_ = auVar238._12_4_;
            auVar260._0_4_ = auVar260._4_4_;
            auVar260._8_4_ = auVar260._12_4_;
            auVar185 = auVar238 & auVar188 | auVar260;
            auVar185 = packssdw(auVar185,auVar185);
            auVar13._8_4_ = 0xffffffff;
            auVar13._0_8_ = 0xffffffffffffffff;
            auVar13._12_4_ = 0xffffffff;
            auVar185 = packssdw(auVar185 ^ auVar13,auVar185 ^ auVar13);
            if ((auVar185 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              left_data_2[(long)iVar251 + uVar74 + 0x12] = uVar79;
            }
            auVar189 = pshufhw(auVar188,auVar188,0x84);
            auVar114 = pshufhw(auVar238,auVar238,0x84);
            auVar190 = pshufhw(auVar189,auVar260,0x84);
            auVar191._8_4_ = 0xffffffff;
            auVar191._0_8_ = 0xffffffffffffffff;
            auVar191._12_4_ = 0xffffffff;
            auVar191 = (auVar190 | auVar114 & auVar189) ^ auVar191;
            auVar189 = packssdw(auVar191,auVar191);
            if ((auVar189 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              left_data_2[(long)iVar251 + uVar74 + 0x13] = uVar79;
            }
            auVar189 = (auVar132 | _DAT_004ce960) ^ _DAT_004ccdb0;
            iVar252 = -(uint)(iVar83 < auVar189._0_4_);
            auVar193._4_4_ = -(uint)(iVar249 < auVar189._4_4_);
            iVar263 = -(uint)(iVar250 < auVar189._8_4_);
            auVar193._12_4_ = -(uint)(iVar264 < auVar189._12_4_);
            auVar239._4_4_ = iVar252;
            auVar239._0_4_ = iVar252;
            auVar239._8_4_ = iVar263;
            auVar239._12_4_ = iVar263;
            auVar185 = pshuflw(auVar185,auVar239,0xe8);
            auVar192._4_4_ = -(uint)(auVar189._4_4_ == iVar249);
            auVar192._12_4_ = -(uint)(auVar189._12_4_ == iVar264);
            auVar192._0_4_ = auVar192._4_4_;
            auVar192._8_4_ = auVar192._12_4_;
            auVar279 = pshuflw(auVar288 & auVar279,auVar192,0xe8);
            in_XMM12 = auVar279 & auVar185;
            auVar193._0_4_ = auVar193._4_4_;
            auVar193._8_4_ = auVar193._12_4_;
            auVar185 = pshuflw(auVar185,auVar193,0xe8);
            auVar281._8_4_ = 0xffffffff;
            auVar281._0_8_ = 0xffffffffffffffff;
            auVar281._12_4_ = 0xffffffff;
            auVar281 = (auVar185 | in_XMM12) ^ auVar281;
            in_XMM11 = packssdw(auVar281,auVar281);
            if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              left_data_2[(long)iVar251 + uVar74 + 0x14] = uVar79;
            }
            auVar193 = auVar192 & auVar239 | auVar193;
            auVar185 = packssdw(auVar193,auVar193);
            auVar14._8_4_ = 0xffffffff;
            auVar14._0_8_ = 0xffffffffffffffff;
            auVar14._12_4_ = 0xffffffff;
            auVar185 = packssdw(auVar185 ^ auVar14,auVar185 ^ auVar14);
            if ((auVar185 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              left_data_2[(long)iVar251 + uVar74 + 0x15] = uVar79;
            }
            auVar185 = (auVar132 | _DAT_004ce950) ^ _DAT_004ccdb0;
            iVar83 = -(uint)(iVar83 < auVar185._0_4_);
            auVar240._4_4_ = -(uint)(iVar249 < auVar185._4_4_);
            iVar250 = -(uint)(iVar250 < auVar185._8_4_);
            auVar240._12_4_ = -(uint)(iVar264 < auVar185._12_4_);
            auVar194._4_4_ = iVar83;
            auVar194._0_4_ = iVar83;
            auVar194._8_4_ = iVar250;
            auVar194._12_4_ = iVar250;
            auVar133._4_4_ = -(uint)(auVar185._4_4_ == iVar249);
            auVar133._12_4_ = -(uint)(auVar185._12_4_ == iVar264);
            auVar133._0_4_ = auVar133._4_4_;
            auVar133._8_4_ = auVar133._12_4_;
            auVar240._0_4_ = auVar240._4_4_;
            auVar240._8_4_ = auVar240._12_4_;
            auVar185 = auVar133 & auVar194 | auVar240;
            auVar185 = packssdw(auVar185,auVar185);
            auVar15._8_4_ = 0xffffffff;
            auVar15._0_8_ = 0xffffffffffffffff;
            auVar15._12_4_ = 0xffffffff;
            auVar185 = packssdw(auVar185 ^ auVar15,auVar185 ^ auVar15);
            if ((auVar185 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              left_data_2[(long)iVar251 + uVar74 + 0x16] = uVar79;
            }
            auVar279 = pshufhw(auVar194,auVar194,0x84);
            auVar185 = pshufhw(auVar133,auVar133,0x84);
            auVar288 = pshufhw(auVar279,auVar240,0x84);
            auVar16._8_4_ = 0xffffffff;
            auVar16._0_8_ = 0xffffffffffffffff;
            auVar16._12_4_ = 0xffffffff;
            auVar185 = packssdw(auVar185 & auVar279,(auVar288 | auVar185 & auVar279) ^ auVar16);
            if ((auVar185 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              left_data_2[(long)iVar251 + uVar74 + 0x17] = uVar79;
            }
            uVar74 = uVar74 + 8;
          } while (((long)iVar84 + 7U & 0xfffffffffffffff8) != uVar74);
        }
      }
    }
    if (bVar101 != 0) {
      uVar95 = 0;
      if (-1 < iVar82) {
        uVar95 = uVar87;
      }
      iVar83 = uVar95 + uVar105;
      if ((int)local_bd0 < 1) {
        if ((0 < (int)uVar106) && (iVar83 != 0)) {
          uVar79 = *puVar90;
          lVar77 = (long)iVar83 + -1;
          auVar119._8_4_ = (int)lVar77;
          auVar119._0_8_ = lVar77;
          auVar119._12_4_ = (int)((ulong)lVar77 >> 0x20);
          uVar74 = 0;
          auVar119 = auVar119 ^ _DAT_004ccdb0;
          do {
            auVar136._8_4_ = (int)uVar74;
            auVar136._0_8_ = uVar74;
            auVar136._12_4_ = (int)(uVar74 >> 0x20);
            auVar185 = (auVar136 | _DAT_004ccda0) ^ _DAT_004ccdb0;
            iVar82 = auVar119._0_4_;
            iVar250 = -(uint)(iVar82 < auVar185._0_4_);
            iVar84 = auVar119._4_4_;
            auVar203._4_4_ = -(uint)(iVar84 < auVar185._4_4_);
            iVar251 = auVar119._8_4_;
            iVar264 = -(uint)(iVar251 < auVar185._8_4_);
            iVar249 = auVar119._12_4_;
            auVar203._12_4_ = -(uint)(iVar249 < auVar185._12_4_);
            auVar245._4_4_ = iVar250;
            auVar245._0_4_ = iVar250;
            auVar245._8_4_ = iVar264;
            auVar245._12_4_ = iVar264;
            auVar279 = pshuflw(in_XMM11,auVar245,0xe8);
            auVar202._4_4_ = -(uint)(auVar185._4_4_ == iVar84);
            auVar202._12_4_ = -(uint)(auVar185._12_4_ == iVar249);
            auVar202._0_4_ = auVar202._4_4_;
            auVar202._8_4_ = auVar202._12_4_;
            auVar288 = pshuflw(in_XMM12,auVar202,0xe8);
            auVar203._0_4_ = auVar203._4_4_;
            auVar203._8_4_ = auVar203._12_4_;
            auVar185 = pshuflw(auVar279,auVar203,0xe8);
            auVar284._8_4_ = 0xffffffff;
            auVar284._0_8_ = 0xffffffffffffffff;
            auVar284._12_4_ = 0xffffffff;
            auVar284 = (auVar185 | auVar288 & auVar279) ^ auVar284;
            auVar185 = packssdw(auVar284,auVar284);
            if ((auVar185 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              (&local_9da)[uVar74 + 1] = uVar79;
            }
            auVar203 = auVar202 & auVar245 | auVar203;
            auVar185 = packssdw(auVar203,auVar203);
            auVar22._8_4_ = 0xffffffff;
            auVar22._0_8_ = 0xffffffffffffffff;
            auVar22._12_4_ = 0xffffffff;
            auVar185 = packssdw(auVar185 ^ auVar22,auVar185 ^ auVar22);
            if ((auVar185._0_4_ >> 0x10 & 1) != 0) {
              (&local_9da)[uVar74 + 2] = uVar79;
            }
            auVar185 = (auVar136 | _DAT_004ccd90) ^ _DAT_004ccdb0;
            iVar250 = -(uint)(iVar82 < auVar185._0_4_);
            auVar262._4_4_ = -(uint)(iVar84 < auVar185._4_4_);
            iVar264 = -(uint)(iVar251 < auVar185._8_4_);
            auVar262._12_4_ = -(uint)(iVar249 < auVar185._12_4_);
            auVar204._4_4_ = iVar250;
            auVar204._0_4_ = iVar250;
            auVar204._8_4_ = iVar264;
            auVar204._12_4_ = iVar264;
            auVar246._4_4_ = -(uint)(auVar185._4_4_ == iVar84);
            auVar246._12_4_ = -(uint)(auVar185._12_4_ == iVar249);
            auVar246._0_4_ = auVar246._4_4_;
            auVar246._8_4_ = auVar246._12_4_;
            auVar262._0_4_ = auVar262._4_4_;
            auVar262._8_4_ = auVar262._12_4_;
            auVar185 = auVar246 & auVar204 | auVar262;
            auVar185 = packssdw(auVar185,auVar185);
            auVar23._8_4_ = 0xffffffff;
            auVar23._0_8_ = 0xffffffffffffffff;
            auVar23._12_4_ = 0xffffffff;
            auVar185 = packssdw(auVar185 ^ auVar23,auVar185 ^ auVar23);
            if ((auVar185 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              (&local_9da)[uVar74 + 3] = uVar79;
            }
            auVar189 = pshufhw(auVar204,auVar204,0x84);
            auVar114 = pshufhw(auVar246,auVar246,0x84);
            auVar190 = pshufhw(auVar189,auVar262,0x84);
            auVar205._8_4_ = 0xffffffff;
            auVar205._0_8_ = 0xffffffffffffffff;
            auVar205._12_4_ = 0xffffffff;
            auVar205 = (auVar190 | auVar114 & auVar189) ^ auVar205;
            auVar189 = packssdw(auVar205,auVar205);
            if ((auVar189 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              (&local_9da)[uVar74 + 4] = uVar79;
            }
            auVar189 = (auVar136 | _DAT_004ce960) ^ _DAT_004ccdb0;
            iVar250 = -(uint)(iVar82 < auVar189._0_4_);
            auVar207._4_4_ = -(uint)(iVar84 < auVar189._4_4_);
            iVar264 = -(uint)(iVar251 < auVar189._8_4_);
            auVar207._12_4_ = -(uint)(iVar249 < auVar189._12_4_);
            auVar247._4_4_ = iVar250;
            auVar247._0_4_ = iVar250;
            auVar247._8_4_ = iVar264;
            auVar247._12_4_ = iVar264;
            auVar185 = pshuflw(auVar185,auVar247,0xe8);
            auVar206._4_4_ = -(uint)(auVar189._4_4_ == iVar84);
            auVar206._12_4_ = -(uint)(auVar189._12_4_ == iVar249);
            auVar206._0_4_ = auVar206._4_4_;
            auVar206._8_4_ = auVar206._12_4_;
            auVar279 = pshuflw(auVar288 & auVar279,auVar206,0xe8);
            in_XMM12 = auVar279 & auVar185;
            auVar207._0_4_ = auVar207._4_4_;
            auVar207._8_4_ = auVar207._12_4_;
            auVar185 = pshuflw(auVar185,auVar207,0xe8);
            auVar285._8_4_ = 0xffffffff;
            auVar285._0_8_ = 0xffffffffffffffff;
            auVar285._12_4_ = 0xffffffff;
            auVar285 = (auVar185 | in_XMM12) ^ auVar285;
            in_XMM11 = packssdw(auVar285,auVar285);
            if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              (&local_9da)[uVar74 + 5] = uVar79;
            }
            auVar207 = auVar206 & auVar247 | auVar207;
            auVar185 = packssdw(auVar207,auVar207);
            auVar24._8_4_ = 0xffffffff;
            auVar24._0_8_ = 0xffffffffffffffff;
            auVar24._12_4_ = 0xffffffff;
            auVar185 = packssdw(auVar185 ^ auVar24,auVar185 ^ auVar24);
            if ((auVar185 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              (&local_9da)[uVar74 + 6] = uVar79;
            }
            auVar185 = (auVar136 | _DAT_004ce950) ^ _DAT_004ccdb0;
            iVar82 = -(uint)(iVar82 < auVar185._0_4_);
            auVar248._4_4_ = -(uint)(iVar84 < auVar185._4_4_);
            iVar251 = -(uint)(iVar251 < auVar185._8_4_);
            auVar248._12_4_ = -(uint)(iVar249 < auVar185._12_4_);
            auVar208._4_4_ = iVar82;
            auVar208._0_4_ = iVar82;
            auVar208._8_4_ = iVar251;
            auVar208._12_4_ = iVar251;
            auVar137._4_4_ = -(uint)(auVar185._4_4_ == iVar84);
            auVar137._12_4_ = -(uint)(auVar185._12_4_ == iVar249);
            auVar137._0_4_ = auVar137._4_4_;
            auVar137._8_4_ = auVar137._12_4_;
            auVar248._0_4_ = auVar248._4_4_;
            auVar248._8_4_ = auVar248._12_4_;
            auVar185 = auVar137 & auVar208 | auVar248;
            auVar185 = packssdw(auVar185,auVar185);
            auVar25._8_4_ = 0xffffffff;
            auVar25._0_8_ = 0xffffffffffffffff;
            auVar25._12_4_ = 0xffffffff;
            auVar185 = packssdw(auVar185 ^ auVar25,auVar185 ^ auVar25);
            if ((auVar185 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              (&local_9da)[uVar74 + 7] = uVar79;
            }
            auVar279 = pshufhw(auVar208,auVar208,0x84);
            auVar185 = pshufhw(auVar137,auVar137,0x84);
            auVar288 = pshufhw(auVar279,auVar248,0x84);
            auVar26._8_4_ = 0xffffffff;
            auVar26._0_8_ = 0xffffffffffffffff;
            auVar26._12_4_ = 0xffffffff;
            auVar185 = packssdw(auVar185 & auVar279,(auVar288 | auVar185 & auVar279) ^ auVar26);
            if ((auVar185 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              (&local_9da)[uVar74 + 8] = uVar79;
            }
            uVar74 = uVar74 + 8;
          } while (((long)iVar83 + 7U & 0xfffffffffffffff8) != uVar74);
        }
      }
      else {
        memcpy(&local_9d8,puVar68,(ulong)(local_bd0 * 2));
        uVar95 = local_bd0;
        if (0 < iVar82) {
          memcpy(&local_9da + __n + 1,puVar68 + __n,(ulong)(uint)(iVar82 * 2));
          uVar95 = iVar82 + local_bd0;
        }
        iVar82 = iVar83 - uVar95;
        if (iVar82 != 0 && (int)uVar95 <= iVar83) {
          uVar74 = (ulong)uVar95;
          uVar79 = (&local_9da)[(int)uVar95];
          lVar77 = (long)iVar82 + -1;
          auVar118._8_4_ = (int)lVar77;
          auVar118._0_8_ = lVar77;
          auVar118._12_4_ = (int)((ulong)lVar77 >> 0x20);
          uVar97 = 0;
          auVar118 = auVar118 ^ _DAT_004ccdb0;
          do {
            auVar134._8_4_ = (int)uVar97;
            auVar134._0_8_ = uVar97;
            auVar134._12_4_ = (int)(uVar97 >> 0x20);
            auVar185 = (auVar134 | _DAT_004ccda0) ^ _DAT_004ccdb0;
            iVar83 = auVar118._0_4_;
            iVar250 = -(uint)(iVar83 < auVar185._0_4_);
            iVar84 = auVar118._4_4_;
            auVar196._4_4_ = -(uint)(iVar84 < auVar185._4_4_);
            iVar251 = auVar118._8_4_;
            iVar264 = -(uint)(iVar251 < auVar185._8_4_);
            iVar249 = auVar118._12_4_;
            auVar196._12_4_ = -(uint)(iVar249 < auVar185._12_4_);
            auVar241._4_4_ = iVar250;
            auVar241._0_4_ = iVar250;
            auVar241._8_4_ = iVar264;
            auVar241._12_4_ = iVar264;
            auVar279 = pshuflw(in_XMM11,auVar241,0xe8);
            auVar195._4_4_ = -(uint)(auVar185._4_4_ == iVar84);
            auVar195._12_4_ = -(uint)(auVar185._12_4_ == iVar249);
            auVar195._0_4_ = auVar195._4_4_;
            auVar195._8_4_ = auVar195._12_4_;
            auVar288 = pshuflw(in_XMM12,auVar195,0xe8);
            auVar196._0_4_ = auVar196._4_4_;
            auVar196._8_4_ = auVar196._12_4_;
            auVar185 = pshuflw(auVar279,auVar196,0xe8);
            auVar282._8_4_ = 0xffffffff;
            auVar282._0_8_ = 0xffffffffffffffff;
            auVar282._12_4_ = 0xffffffff;
            auVar282 = (auVar185 | auVar288 & auVar279) ^ auVar282;
            auVar185 = packssdw(auVar282,auVar282);
            if ((auVar185 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              (&local_9da)[uVar74 + uVar97 + 1] = uVar79;
            }
            auVar196 = auVar195 & auVar241 | auVar196;
            auVar185 = packssdw(auVar196,auVar196);
            auVar17._8_4_ = 0xffffffff;
            auVar17._0_8_ = 0xffffffffffffffff;
            auVar17._12_4_ = 0xffffffff;
            auVar185 = packssdw(auVar185 ^ auVar17,auVar185 ^ auVar17);
            if ((auVar185._0_4_ >> 0x10 & 1) != 0) {
              (&local_9da)[uVar74 + uVar97 + 2] = uVar79;
            }
            auVar185 = (auVar134 | _DAT_004ccd90) ^ _DAT_004ccdb0;
            iVar250 = -(uint)(iVar83 < auVar185._0_4_);
            auVar261._4_4_ = -(uint)(iVar84 < auVar185._4_4_);
            iVar264 = -(uint)(iVar251 < auVar185._8_4_);
            auVar261._12_4_ = -(uint)(iVar249 < auVar185._12_4_);
            auVar197._4_4_ = iVar250;
            auVar197._0_4_ = iVar250;
            auVar197._8_4_ = iVar264;
            auVar197._12_4_ = iVar264;
            auVar242._4_4_ = -(uint)(auVar185._4_4_ == iVar84);
            auVar242._12_4_ = -(uint)(auVar185._12_4_ == iVar249);
            auVar242._0_4_ = auVar242._4_4_;
            auVar242._8_4_ = auVar242._12_4_;
            auVar261._0_4_ = auVar261._4_4_;
            auVar261._8_4_ = auVar261._12_4_;
            auVar185 = auVar242 & auVar197 | auVar261;
            auVar185 = packssdw(auVar185,auVar185);
            auVar18._8_4_ = 0xffffffff;
            auVar18._0_8_ = 0xffffffffffffffff;
            auVar18._12_4_ = 0xffffffff;
            auVar185 = packssdw(auVar185 ^ auVar18,auVar185 ^ auVar18);
            if ((auVar185 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              (&local_9da)[uVar74 + uVar97 + 3] = uVar79;
            }
            auVar189 = pshufhw(auVar197,auVar197,0x84);
            auVar114 = pshufhw(auVar242,auVar242,0x84);
            auVar190 = pshufhw(auVar189,auVar261,0x84);
            auVar198._8_4_ = 0xffffffff;
            auVar198._0_8_ = 0xffffffffffffffff;
            auVar198._12_4_ = 0xffffffff;
            auVar198 = (auVar190 | auVar114 & auVar189) ^ auVar198;
            auVar189 = packssdw(auVar198,auVar198);
            if ((auVar189 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              (&local_9da)[uVar74 + uVar97 + 4] = uVar79;
            }
            auVar189 = (auVar134 | _DAT_004ce960) ^ _DAT_004ccdb0;
            iVar250 = -(uint)(iVar83 < auVar189._0_4_);
            auVar200._4_4_ = -(uint)(iVar84 < auVar189._4_4_);
            iVar264 = -(uint)(iVar251 < auVar189._8_4_);
            auVar200._12_4_ = -(uint)(iVar249 < auVar189._12_4_);
            auVar243._4_4_ = iVar250;
            auVar243._0_4_ = iVar250;
            auVar243._8_4_ = iVar264;
            auVar243._12_4_ = iVar264;
            auVar185 = pshuflw(auVar185,auVar243,0xe8);
            auVar199._4_4_ = -(uint)(auVar189._4_4_ == iVar84);
            auVar199._12_4_ = -(uint)(auVar189._12_4_ == iVar249);
            auVar199._0_4_ = auVar199._4_4_;
            auVar199._8_4_ = auVar199._12_4_;
            auVar279 = pshuflw(auVar288 & auVar279,auVar199,0xe8);
            in_XMM12 = auVar279 & auVar185;
            auVar200._0_4_ = auVar200._4_4_;
            auVar200._8_4_ = auVar200._12_4_;
            auVar185 = pshuflw(auVar185,auVar200,0xe8);
            auVar283._8_4_ = 0xffffffff;
            auVar283._0_8_ = 0xffffffffffffffff;
            auVar283._12_4_ = 0xffffffff;
            auVar283 = (auVar185 | in_XMM12) ^ auVar283;
            in_XMM11 = packssdw(auVar283,auVar283);
            if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              (&local_9da)[uVar74 + uVar97 + 5] = uVar79;
            }
            auVar200 = auVar199 & auVar243 | auVar200;
            auVar185 = packssdw(auVar200,auVar200);
            auVar19._8_4_ = 0xffffffff;
            auVar19._0_8_ = 0xffffffffffffffff;
            auVar19._12_4_ = 0xffffffff;
            auVar185 = packssdw(auVar185 ^ auVar19,auVar185 ^ auVar19);
            if ((auVar185 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              (&local_9da)[uVar74 + uVar97 + 6] = uVar79;
            }
            auVar185 = (auVar134 | _DAT_004ce950) ^ _DAT_004ccdb0;
            iVar83 = -(uint)(iVar83 < auVar185._0_4_);
            auVar244._4_4_ = -(uint)(iVar84 < auVar185._4_4_);
            iVar251 = -(uint)(iVar251 < auVar185._8_4_);
            auVar244._12_4_ = -(uint)(iVar249 < auVar185._12_4_);
            auVar201._4_4_ = iVar83;
            auVar201._0_4_ = iVar83;
            auVar201._8_4_ = iVar251;
            auVar201._12_4_ = iVar251;
            auVar135._4_4_ = -(uint)(auVar185._4_4_ == iVar84);
            auVar135._12_4_ = -(uint)(auVar185._12_4_ == iVar249);
            auVar135._0_4_ = auVar135._4_4_;
            auVar135._8_4_ = auVar135._12_4_;
            auVar244._0_4_ = auVar244._4_4_;
            auVar244._8_4_ = auVar244._12_4_;
            auVar185 = auVar135 & auVar201 | auVar244;
            auVar185 = packssdw(auVar185,auVar185);
            auVar20._8_4_ = 0xffffffff;
            auVar20._0_8_ = 0xffffffffffffffff;
            auVar20._12_4_ = 0xffffffff;
            auVar185 = packssdw(auVar185 ^ auVar20,auVar185 ^ auVar20);
            if ((auVar185 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              (&local_9da)[uVar74 + uVar97 + 7] = uVar79;
            }
            auVar279 = pshufhw(auVar201,auVar201,0x84);
            auVar185 = pshufhw(auVar135,auVar135,0x84);
            auVar288 = pshufhw(auVar279,auVar244,0x84);
            auVar21._8_4_ = 0xffffffff;
            auVar21._0_8_ = 0xffffffffffffffff;
            auVar21._12_4_ = 0xffffffff;
            auVar185 = packssdw(auVar185 & auVar279,(auVar288 | auVar185 & auVar279) ^ auVar21);
            if ((auVar185 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              (&local_9da)[uVar74 + uVar97 + 8] = uVar79;
            }
            uVar97 = uVar97 + 8;
          } while (((long)iVar82 + 7U & 0xfffffffffffffff8) != uVar97);
        }
      }
    }
    puVar76 = &local_9d8;
    if ((filter_intra_mode != '\x05') || (bVar63 != 0)) {
      if (((int)local_bd0 < 1) || ((int)uVar106 < 1)) {
        if ((0 < (int)local_bd0) || (puVar68 = puVar90, 0 < (int)uVar106)) {
          local_9da = *puVar68;
          goto LAB_003a1df3;
        }
        local_9da = (uint16_t)iVar66;
      }
      else {
        local_9da = puVar68[-1];
LAB_003a1df3:
      }
      left_data_2[0xf] = local_9da;
    }
    puVar90 = left_data_2 + 0x10;
    if (filter_intra_mode != '\x05') {
      uVar88 = 1;
      if (1 < (int)uVar87) {
        uVar88 = (ulong)uVar87;
      }
      lVar77 = 0;
      do {
        left_data[lVar77 + 0x21] = *puVar90;
        lVar77 = lVar77 + 0x21;
        puVar90 = puVar90 + 1;
      } while (uVar88 * 0x21 != lVar77);
      memcpy(left_data,&local_9da,__n * 2 + 2);
      lVar77 = (ulong)filter_intra_mode * 0x40;
      lVar72 = 1;
      do {
        lVar75 = lVar72 + -1;
        lVar94 = 1;
        do {
          uVar78 = (&uStack_8ba)[lVar75 * 0x21 + lVar94];
          uVar3 = left_data[lVar75 * 0x21 + lVar94];
          uVar4 = left_data[lVar75 * 0x21 + lVar94 + 1];
          uVar5 = left_data[lVar75 * 0x21 + lVar94 + 2];
          uVar6 = left_data[lVar75 * 0x21 + lVar94 + 3];
          uVar7 = (&uStack_8ba)[lVar72 * 0x21 + lVar94];
          uVar8 = (&uStack_8ba)[(lVar72 + 1) * 0x21 + lVar94];
          uVar74 = 0;
          do {
            iVar82 = (int)((int)*(char *)(lVar77 + 0x553ff6 + uVar74 * 8) * (uint)uVar8 +
                           (int)*(char *)(lVar77 + 0x553ff5 + uVar74 * 8) * (uint)uVar7 +
                           (int)*(char *)(lVar77 + 0x553ff4 + uVar74 * 8) * (uint)uVar6 +
                           (int)*(char *)(lVar77 + 0x553ff3 + uVar74 * 8) * (uint)uVar5 +
                           (int)*(char *)(lVar77 + 0x553ff2 + uVar74 * 8) * (uint)uVar4 +
                           (int)*(char *)(lVar77 + 0x553ff1 + uVar74 * 8) * (uint)uVar3 +
                           (int)av1_filter_intra_taps[filter_intra_mode][uVar74][0] * (uint)uVar78 +
                          8) >> 4;
            if (uVar104 == 10) {
              if (0x3fe < iVar82) {
                iVar82 = 0x3ff;
              }
            }
            else if (uVar104 == 0xc) {
              if (0xffe < iVar82) {
                iVar82 = 0xfff;
              }
            }
            else if (0xfe < iVar82) {
              iVar82 = 0xff;
            }
            if (iVar82 < 1) {
              iVar82 = 0;
            }
            left_data[(ulong)(((uint)(uVar74 >> 2) & 0x3fffffff) + (int)lVar72) * 0x21 +
                      (ulong)(((uint)uVar74 & 3) + (int)lVar94)] = (uint16_t)iVar82;
            uVar74 = uVar74 + 1;
          } while (uVar74 != 8);
          lVar94 = lVar94 + 4;
        } while (lVar94 <= (long)__n);
        lVar72 = lVar72 + 2;
      } while (lVar72 <= (long)__n_01);
      lVar77 = 0;
      do {
        memcpy(dst,(void *)((long)left_data + lVar77 + 0x44),__n * 2);
        lVar77 = lVar77 + 0x42;
        dst = (uint8_t *)((long)dst + (long)dst_stride * 2);
      } while (uVar88 * 0x42 != lVar77);
      return;
    }
    if (enable_intra_edge_filter == 0) {
      uVar95 = 0;
      uVar106 = 0;
    }
    else {
      if ((uVar98 != 0x5a) && (uVar98 != 0xb4)) {
        if ((bVar101 != 0) && ((bVar103 != 0 && (0x17 < (int)(uVar105 + uVar87))))) {
          left_data_2[0xf] =
               (uint16_t)
               (((uint)local_9d8 + (uint)left_data_2[0x10]) * 5 +
                ((uint)local_9da + (uint)local_9da * 2) * 2 + 8 >> 4);
          local_9da = left_data_2[0xf];
        }
        if ((0 < (int)local_bd0) && (bVar101 != 0)) {
          iVar82 = intra_edge_filter_strength(uVar105,uVar87,uVar98 - 0x5a,uVar91);
          uVar95 = 0;
          if ((int)uVar98 < 0x5a) {
            uVar95 = uVar87;
          }
          (*av1_highbd_filter_intra_edge)(&local_9da,local_bd0 + 1 + uVar95,iVar82);
        }
        if ((0 < (int)uVar106) && (bVar103 != 0)) {
          iVar82 = intra_edge_filter_strength(uVar87,uVar105,uVar98 - 0xb4,uVar91);
          uVar95 = 0;
          if (0xb4 < (int)uVar98) {
            uVar95 = uVar105;
          }
          (*av1_highbd_filter_intra_edge)(left_data_2 + 0xf,uVar106 + 1 + uVar95,iVar82);
        }
      }
      uVar64 = uVar98 - 0x5a;
      uVar106 = 0;
      uVar95 = -uVar64;
      if (0 < (int)uVar64) {
        uVar95 = uVar64;
      }
      if ((uVar64 != 0) && (uVar95 < 0x28)) {
        uVar106 = (uint)((int)(uVar105 + uVar87) < (int)((uint)(uVar91 == 0) * 8 + 9));
      }
      if ((bVar101 != 0) && (uVar106 != 0)) {
        uVar95 = 0;
        if ((int)uVar98 < 0x5a) {
          uVar95 = uVar87;
        }
        (*av1_highbd_upsample_intra_edge)(puVar76,uVar95 + uVar105,uVar104);
      }
      uVar96 = uVar98 - 0xb4;
      uVar95 = 0;
      uVar64 = -uVar96;
      if (0 < (int)uVar96) {
        uVar64 = uVar96;
      }
      if ((uVar96 != 0) && (uVar64 < 0x28)) {
        uVar95 = (uint)((int)(uVar105 + uVar87) < (int)((uint)(uVar91 == 0) * 8 + 9));
      }
      if ((bVar103 != 0) && (uVar95 != 0)) {
        uVar64 = 0;
        if (0xb4 < (int)uVar98) {
          uVar64 = uVar105;
        }
        (*av1_highbd_upsample_intra_edge)(puVar90,uVar64 + uVar87,uVar104);
      }
    }
    uVar64 = uVar98;
    if (uVar98 - 1 < 0x59) {
LAB_003a2298:
      uVar64 = (uint)dr_intra_derivative[uVar64];
    }
    else {
      uVar64 = 1;
      if (uVar98 - 0x5b < 0x59) {
        uVar64 = 0xb4 - uVar98;
        goto LAB_003a2298;
      }
    }
    if (uVar98 - 0x5b < 0x59) {
      uVar74 = (ulong)(int)(uVar98 - 0x5a);
LAB_003a22d1:
      uVar91 = (uint)dr_intra_derivative[uVar74];
    }
    else {
      uVar91 = 1;
      if (uVar98 - 0xb5 < 0x59) {
        uVar74 = (ulong)(0x10e - uVar98);
        goto LAB_003a22d1;
      }
    }
    lVar77 = (long)dst_stride;
    if (uVar98 - 1 < 0x59) {
      pp_Var100 = (_func_void_uint8_t_ptr_ptrdiff_t_int_int_uint8_t_ptr_uint8_t_ptr_int_int_int **)
                  &av1_highbd_dr_prediction_z1;
    }
    else {
      if (uVar98 - 0x5b < 0x59) {
        (*av1_highbd_dr_prediction_z2)
                  ((uint16_t *)dst,lVar77,uVar105,uVar87,puVar76,puVar90,uVar106,uVar95,uVar64,
                   uVar91,uVar104);
        return;
      }
      if (0x58 < uVar98 - 0xb5) {
        if (uVar98 == 0xb4) {
          (*pred_high[2][uVar88])((uint16_t *)dst,lVar77,puVar76,puVar90,uVar104);
          return;
        }
        if (uVar98 != 0x5a) {
          return;
        }
        (*pred_high[1][uVar88])((uint16_t *)dst,lVar77,puVar76,puVar90,uVar104);
        return;
      }
      pp_Var100 = (_func_void_uint8_t_ptr_ptrdiff_t_int_int_uint8_t_ptr_uint8_t_ptr_int_int_int **)
                  &av1_highbd_dr_prediction_z3;
      uVar106 = uVar95;
    }
    goto LAB_003a2309;
  }
  lVar77 = (long)ref_stride;
  memset(left_data,0x81,0xa0);
  uVar104 = 0x3a063c;
  memset(left_data_2,0x7f,0xa0);
  if ((byte)(mode - 9) < 0xf8) {
    bVar101 = bVar63 & 2;
    bVar103 = bVar63 & 4;
    bVar63 = bVar63 & 0x10;
  }
  else {
    bVar101 = 0x5a < (int)uVar98;
    bVar103 = (int)uVar98 < 0xb4;
    bVar63 = 1;
  }
  pbVar107 = ref + -lVar77;
  pbVar102 = ref + -1;
  if (filter_intra_mode != '\x05') {
    bVar103 = 1;
    bVar101 = 1;
  }
  if ((bVar103 == 0 && uVar106 == 0) || (bVar101 == 0 && local_bd0 == 0)) {
    if (bVar101 == 0) {
      if ((int)uVar106 < 1) {
        bVar101 = 0x7f;
        goto LAB_003a0cd6;
      }
    }
    else {
      pbVar102 = pbVar107;
      if ((int)local_bd0 < 1) {
        bVar101 = 0x81;
        goto LAB_003a0cd6;
      }
    }
    bVar101 = *pbVar102;
LAB_003a0cd6:
    uVar105 = 1;
    if (1 < (int)uVar87) {
      uVar105 = uVar87;
    }
    do {
      memset(dst,(uint)bVar101,__n);
      dst = dst + dst_stride;
      uVar105 = uVar105 - 1;
    } while (uVar105 != 0);
    return;
  }
  puVar90 = left_data + 8;
  if (bVar101 != 0) {
    uVar64 = 0;
    if (-1 < (int)uVar95) {
      uVar64 = uVar105;
    }
    iVar66 = uVar64 + uVar87;
    if ((int)uVar106 < 1) {
      if (0 < (int)local_bd0) {
        bVar2 = *pbVar107;
        goto LAB_003a0d2d;
      }
    }
    else {
      uVar99 = 0;
      pbVar85 = pbVar102;
      do {
        *(byte *)((long)left_data + uVar99 + 0x10) = *pbVar85;
        uVar99 = uVar99 + 1;
        pbVar85 = pbVar85 + lVar77;
      } while (uVar97 != uVar99);
      if ((0 < (int)uVar95) && ((int)uVar99 < (int)(uVar95 + uVar87))) {
        puVar86 = ref + lVar77 * uVar97 + -1;
        do {
          *(uint8_t *)((long)left_data + uVar97 + 0x10) = *puVar86;
          uVar97 = uVar97 + 1;
          puVar86 = puVar86 + lVar77;
        } while ((long)uVar97 < (long)(int)(uVar95 + uVar87));
        uVar99 = uVar97 & 0xffffffff;
      }
      iVar83 = (int)uVar99;
      if (iVar66 - iVar83 != 0 && iVar83 <= iVar66) {
        puVar90 = (uint16_t *)((long)puVar90 + (long)iVar83);
        bVar2 = *(byte *)((long)left_data + (long)iVar83 + 0xf);
        iVar66 = iVar66 - iVar83;
LAB_003a0d2d:
        uVar104 = 0x3a0d32;
        memset(puVar90,(uint)bVar2,(long)iVar66);
      }
    }
  }
  if (bVar103 != 0) {
    uVar95 = 0;
    if (-1 < iVar82) {
      uVar95 = uVar87;
    }
    iVar66 = uVar95 + uVar105;
    if ((int)local_bd0 < 1) {
      if (0 < (int)uVar106) {
        uVar104 = 0x3a10e7;
        memset(left_data_2 + 8,(uint)*pbVar102,(long)iVar66);
      }
    }
    else {
      uVar104 = 0x3a0d81;
      memcpy(left_data_2 + 8,pbVar107,__n_00);
      uVar95 = local_bd0;
      if (0 < iVar82) {
        uVar104 = 0x3a0da5;
        memcpy((void *)((long)left_data_2 + __n + 0x10),pbVar107 + __n,uVar74);
        uVar95 = iVar82 + local_bd0;
      }
      if (iVar66 - uVar95 != 0 && (int)uVar95 <= iVar66) {
        uVar104 = 0x3a0de2;
        memset((void *)((long)left_data_2 + (ulong)uVar95 + 0x10),
               (uint)*(byte *)((long)left_data_2 + (long)(int)uVar95 + 0xf),
               (long)(int)(iVar66 - uVar95));
      }
    }
  }
  puVar76 = left_data_2 + 8;
  if ((filter_intra_mode != '\x05') || (bVar63 != 0)) {
    if (((int)local_bd0 < 1) || ((int)uVar106 < 1)) {
      if (((int)local_bd0 < 1) &&
         (left_data_2[7]._1_1_ = 0x80, pbVar107 = pbVar102,
         left_data[7]._1_1_ = left_data_2[7]._1_1_, (int)uVar106 < 1)) goto LAB_003a1148;
    }
    else {
      pbVar107 = pbVar107 + -1;
    }
    left_data_2[7]._1_1_ = *pbVar107;
    left_data[7]._1_1_ = left_data_2[7]._1_1_;
  }
LAB_003a1148:
  if (filter_intra_mode != '\x05') {
    (*av1_filter_intra_predictor)
              (dst,(long)dst_stride,tx_size,(uint8_t *)puVar76,(uint8_t *)(left_data + 8),
               (uint)filter_intra_mode);
    return;
  }
  if (enable_intra_edge_filter == 0) {
    uVar64 = 0;
    uVar106 = 0;
  }
  else {
    if ((uVar98 != 0x5a) && (uVar98 != 0xb4)) {
      if ((bVar103 != 0) && ((bVar101 != 0 && (0x17 < (int)(uVar105 + uVar87))))) {
        left_data_2[7]._1_1_ =
             (byte)(((uint)(byte)left_data_2[8] + (uint)(byte)left_data[8]) * 5 +
                    (uint)left_data_2[7]._1_1_ * 6 + 8 >> 4);
        left_data[7]._1_1_ = left_data_2[7]._1_1_;
      }
      if ((0 < (int)local_bd0) && (bVar103 != 0)) {
        iVar82 = intra_edge_filter_strength(uVar105,uVar87,uVar98 - 0x5a,uVar91);
        uVar95 = 0;
        if ((int)uVar98 < 0x5a) {
          uVar95 = uVar87;
        }
        uVar104 = 0x3a1226;
        (*av1_filter_intra_edge)((uint8_t *)((long)left_data_2 + 0xf),local_bd0 + 1 + uVar95,iVar82)
        ;
      }
      if ((0 < (int)uVar106) && (bVar101 != 0)) {
        iVar82 = intra_edge_filter_strength(uVar87,uVar105,uVar98 - 0xb4,uVar91);
        uVar95 = 0;
        if (0xb4 < (int)uVar98) {
          uVar95 = uVar105;
        }
        uVar104 = 0x3a1287;
        (*av1_filter_intra_edge)((uint8_t *)((long)left_data + 0xf),uVar106 + 1 + uVar95,iVar82);
      }
    }
    uVar64 = uVar98 - 0x5a;
    uVar106 = 0;
    uVar95 = -uVar64;
    if (0 < (int)uVar64) {
      uVar95 = uVar64;
    }
    if ((uVar64 != 0) && (uVar95 < 0x28)) {
      uVar106 = (uint)((int)(uVar105 + uVar87) < (int)((uint)(uVar91 == 0) * 8 + 9));
    }
    if ((bVar103 != 0) && (uVar106 != 0)) {
      uVar95 = 0;
      if ((int)uVar98 < 0x5a) {
        uVar95 = uVar87;
      }
      uVar104 = 0x3a12ec;
      (*av1_upsample_intra_edge)((uint8_t *)puVar76,uVar95 + uVar105);
    }
    uVar96 = uVar98 - 0xb4;
    uVar64 = 0;
    uVar95 = -uVar96;
    if (0 < (int)uVar96) {
      uVar95 = uVar96;
    }
    if ((uVar96 != 0) && (uVar95 < 0x28)) {
      uVar64 = (uint)((int)(uVar105 + uVar87) < (int)((uint)(uVar91 == 0) * 8 + 9));
    }
    if ((bVar101 != 0) && (uVar64 != 0)) {
      uVar95 = 0;
      if (0xb4 < (int)uVar98) {
        uVar95 = uVar105;
      }
      uVar104 = 0x3a135f;
      (*av1_upsample_intra_edge)((uint8_t *)(left_data + 8),uVar95 + uVar87);
    }
  }
  uVar95 = uVar98;
  if (uVar98 - 1 < 0x59) {
LAB_003a13c3:
    uVar91 = (uint)dr_intra_derivative[uVar95];
  }
  else {
    uVar91 = 1;
    if (uVar98 - 0x5b < 0x59) {
      uVar95 = 0xb4 - uVar98;
      goto LAB_003a13c3;
    }
  }
  if (uVar98 - 0x5b < 0x59) {
    uVar74 = (ulong)(int)(uVar98 - 0x5a);
LAB_003a13fc:
    uVar95 = (uint)dr_intra_derivative[uVar74];
  }
  else {
    uVar95 = 1;
    if (uVar98 - 0xb5 < 0x59) {
      uVar74 = (ulong)(0x10e - uVar98);
      goto LAB_003a13fc;
    }
  }
  if (uVar98 - 1 < 0x59) {
    pp_Var100 = &av1_dr_prediction_z1;
    puVar90 = left_data + 8;
    uVar64 = uVar91;
    uVar91 = uVar95;
  }
  else {
    puVar90 = left_data + 8;
    if (uVar98 - 0x5b < 0x59) {
      pp_Var100 = (_func_void_uint8_t_ptr_ptrdiff_t_int_int_uint8_t_ptr_uint8_t_ptr_int_int_int **)
                  &av1_dr_prediction_z2;
      uVar104 = uVar95;
    }
    else {
      if (0x58 < uVar98 - 0xb5) {
        if (uVar98 == 0xb4) {
          (*pred[2][uVar88])(dst,(long)dst_stride,(uint8_t *)puVar76,(uint8_t *)puVar90);
          return;
        }
        if (uVar98 != 0x5a) {
          return;
        }
        (*pred[1][uVar88])(dst,(long)dst_stride,(uint8_t *)puVar76,(uint8_t *)puVar90);
        return;
      }
      pp_Var100 = &av1_dr_prediction_z3;
      uVar106 = uVar64;
      uVar64 = uVar91;
      uVar91 = uVar95;
    }
  }
LAB_003a2309:
  (**pp_Var100)((uint16_t *)dst,(long)dst_stride,uVar105,uVar87,puVar76,puVar90,uVar106,uVar64,
                uVar91,uVar104);
  return;
}

Assistant:

void av1_predict_intra_block(const MACROBLOCKD *xd, BLOCK_SIZE sb_size,
                             int enable_intra_edge_filter, int wpx, int hpx,
                             TX_SIZE tx_size, PREDICTION_MODE mode,
                             int angle_delta, int use_palette,
                             FILTER_INTRA_MODE filter_intra_mode,
                             const uint8_t *ref, int ref_stride, uint8_t *dst,
                             int dst_stride, int col_off, int row_off,
                             int plane) {
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const int txwpx = tx_size_wide[tx_size];
  const int txhpx = tx_size_high[tx_size];
  const int x = col_off << MI_SIZE_LOG2;
  const int y = row_off << MI_SIZE_LOG2;
  const int is_hbd = is_cur_buf_hbd(xd);

  assert(mode < INTRA_MODES);

  if (use_palette) {
    int r, c;
    const uint8_t *const map = xd->plane[plane != 0].color_index_map +
                               xd->color_index_map_offset[plane != 0];
    const uint16_t *const palette =
        mbmi->palette_mode_info.palette_colors + plane * PALETTE_MAX_SIZE;
    if (is_hbd) {
      uint16_t *dst16 = CONVERT_TO_SHORTPTR(dst);
      for (r = 0; r < txhpx; ++r) {
        for (c = 0; c < txwpx; ++c) {
          dst16[r * dst_stride + c] = palette[map[(r + y) * wpx + c + x]];
        }
      }
    } else {
      for (r = 0; r < txhpx; ++r) {
        for (c = 0; c < txwpx; ++c) {
          dst[r * dst_stride + c] =
              (uint8_t)palette[map[(r + y) * wpx + c + x]];
        }
      }
    }
    return;
  }

  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const int ss_x = pd->subsampling_x;
  const int ss_y = pd->subsampling_y;
  const int have_top =
      row_off || (ss_y ? xd->chroma_up_available : xd->up_available);
  const int have_left =
      col_off || (ss_x ? xd->chroma_left_available : xd->left_available);

  // Distance between the right edge of this prediction block to
  // the frame right edge
  const int xr = (xd->mb_to_right_edge >> (3 + ss_x)) + wpx - x - txwpx;
  // Distance between the bottom edge of this prediction block to
  // the frame bottom edge
  const int yd = (xd->mb_to_bottom_edge >> (3 + ss_y)) + hpx - y - txhpx;
  const int use_filter_intra = filter_intra_mode != FILTER_INTRA_MODES;
  const int is_dr_mode = av1_is_directional_mode(mode);

  // The computations in this function, as well as in build_intra_predictors(),
  // are generalized for all intra modes. Some of these operations are not
  // required since non-directional intra modes (i.e., DC, SMOOTH, SMOOTH_H,
  // SMOOTH_V, and PAETH) specifically require left and top neighbors. Hence, a
  // separate function build_non_directional_intra_predictors() is introduced
  // for these modes to avoid redundant computations while generating pred data.

  const int n_top_px = have_top ? AOMMIN(txwpx, xr + txwpx) : 0;
  const int n_left_px = have_left ? AOMMIN(txhpx, yd + txhpx) : 0;
  if (!use_filter_intra && !is_dr_mode) {
#if CONFIG_AV1_HIGHBITDEPTH
    if (is_hbd) {
      highbd_build_non_directional_intra_predictors(
          ref, ref_stride, dst, dst_stride, mode, tx_size, n_top_px, n_left_px,
          xd->bd);
      return;
    }
#endif  // CONFIG_AV1_HIGHBITDEPTH
    build_non_directional_intra_predictors(ref, ref_stride, dst, dst_stride,
                                           mode, tx_size, n_top_px, n_left_px);
    return;
  }

  const int txw = tx_size_wide_unit[tx_size];
  const int txh = tx_size_high_unit[tx_size];
  const int mi_row = -xd->mb_to_top_edge >> (3 + MI_SIZE_LOG2);
  const int mi_col = -xd->mb_to_left_edge >> (3 + MI_SIZE_LOG2);
  const int right_available =
      mi_col + ((col_off + txw) << ss_x) < xd->tile.mi_col_end;
  const int bottom_available =
      (yd > 0) && (mi_row + ((row_off + txh) << ss_y) < xd->tile.mi_row_end);

  const PARTITION_TYPE partition = mbmi->partition;

  BLOCK_SIZE bsize = mbmi->bsize;
  // force 4x4 chroma component block size.
  if (ss_x || ss_y) {
    bsize = scale_chroma_bsize(bsize, ss_x, ss_y);
  }

  int p_angle = 0;
  int need_top_right = extend_modes[mode] & NEED_ABOVERIGHT;
  int need_bottom_left = extend_modes[mode] & NEED_BOTTOMLEFT;

  if (use_filter_intra) {
    need_top_right = 0;
    need_bottom_left = 0;
  }
  if (is_dr_mode) {
    p_angle = mode_to_angle_map[mode] + angle_delta;
    need_top_right = p_angle < 90;
    need_bottom_left = p_angle > 180;
  }

  // Possible states for have_top_right(TR) and have_bottom_left(BL)
  // -1 : TR and BL are not needed
  //  0 : TR and BL are needed but not available
  // > 0 : TR and BL are needed and pixels are available
  const int have_top_right =
      need_top_right ? has_top_right(sb_size, bsize, mi_row, mi_col, have_top,
                                     right_available, partition, tx_size,
                                     row_off, col_off, ss_x, ss_y)
                     : -1;
  const int have_bottom_left =
      need_bottom_left ? has_bottom_left(sb_size, bsize, mi_row, mi_col,
                                         bottom_available, have_left, partition,
                                         tx_size, row_off, col_off, ss_x, ss_y)
                       : -1;

  const int disable_edge_filter = !enable_intra_edge_filter;
  const int intra_edge_filter_type = get_intra_edge_filter_type(xd, plane);
  const int n_topright_px =
      have_top_right > 0 ? AOMMIN(txwpx, xr) : have_top_right;
  const int n_bottomleft_px =
      have_bottom_left > 0 ? AOMMIN(txhpx, yd) : have_bottom_left;
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_hbd) {
    highbd_build_directional_and_filter_intra_predictors(
        ref, ref_stride, dst, dst_stride, mode, p_angle, filter_intra_mode,
        tx_size, disable_edge_filter, n_top_px, n_topright_px, n_left_px,
        n_bottomleft_px, intra_edge_filter_type, xd->bd);
    return;
  }
#endif
  build_directional_and_filter_intra_predictors(
      ref, ref_stride, dst, dst_stride, mode, p_angle, filter_intra_mode,
      tx_size, disable_edge_filter, n_top_px, n_topright_px, n_left_px,
      n_bottomleft_px, intra_edge_filter_type);
}